

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  Primitive PVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCRayQueryContext *pRVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [60];
  undefined1 auVar66 [60];
  undefined1 auVar67 [12];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  ulong uVar95;
  ulong uVar96;
  byte bVar97;
  byte bVar98;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  Primitive *pPVar99;
  uint uVar100;
  long lVar101;
  bool bVar102;
  ulong uVar103;
  uint uVar104;
  uint uVar162;
  uint uVar163;
  uint uVar165;
  uint uVar166;
  uint uVar167;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  uint uVar164;
  uint uVar168;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar156 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar161 [64];
  float pp;
  float fVar169;
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar191;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar189;
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar213;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar214;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar230;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar228;
  float fVar229;
  undefined1 auVar227 [64];
  float fVar231;
  float fVar232;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  float fVar250;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar251 [64];
  undefined1 auVar266 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar252 [32];
  float fVar256;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar261 [64];
  float fVar265;
  undefined1 auVar267 [64];
  undefined1 auVar268 [16];
  float fVar270;
  undefined1 auVar269 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  undefined1 auVar275 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar276 [64];
  undefined1 auVar277 [16];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [32];
  undefined1 local_b40 [16];
  undefined1 (*local_b30) [32];
  Primitive *local_b28;
  Primitive *local_b20;
  ulong local_b18;
  ulong local_b10;
  ulong local_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [64];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  undefined8 uStack_160;
  float afStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar147 [32];
  undefined1 auVar157 [64];
  undefined1 auVar160 [64];
  
  PVar7 = prim[1];
  uVar96 = (ulong)(byte)PVar7;
  lVar101 = uVar96 * 0x19;
  fVar232 = *(float *)(prim + lVar101 + 0x12);
  auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar26 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar111 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar110 = vsubps_avx(auVar107,*(undefined1 (*) [16])(prim + lVar101 + 6));
  fVar231 = fVar232 * auVar110._0_4_;
  fVar169 = fVar232 * auVar111._0_4_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar96 * 4 + 6);
  auVar119 = vpmovsxbd_avx2(auVar107);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar96 * 5 + 6);
  auVar117 = vpmovsxbd_avx2(auVar26);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar96 * 6 + 6);
  auVar120 = vpmovsxbd_avx2(auVar108);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = *(ulong *)(prim + uVar96 * 0xb + 6);
  auVar121 = vpmovsxbd_avx2(auVar266);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar126 = vpmovsxbd_avx2(auVar105);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar122 = vcvtdq2ps_avx(auVar126);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar96 + 6);
  auVar118 = vpmovsxbd_avx2(auVar6);
  auVar118 = vcvtdq2ps_avx(auVar118);
  uVar103 = (ulong)(uint)((int)(uVar96 * 9) * 2);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar103 + 6);
  auVar123 = vpmovsxbd_avx2(auVar109);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar103 + uVar96 + 6);
  auVar124 = vpmovsxbd_avx2(auVar106);
  auVar124 = vcvtdq2ps_avx(auVar124);
  uVar95 = (ulong)(uint)((int)(uVar96 * 5) << 2);
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *(ulong *)(prim + uVar95 + 6);
  auVar116 = vpmovsxbd_avx2(auVar277);
  auVar125 = vcvtdq2ps_avx(auVar116);
  auVar272 = ZEXT3264(auVar125);
  auVar137._4_4_ = fVar169;
  auVar137._0_4_ = fVar169;
  auVar137._8_4_ = fVar169;
  auVar137._12_4_ = fVar169;
  auVar137._16_4_ = fVar169;
  auVar137._20_4_ = fVar169;
  auVar137._24_4_ = fVar169;
  auVar137._28_4_ = fVar169;
  auVar131._8_4_ = 1;
  auVar131._0_8_ = 0x100000001;
  auVar131._12_4_ = 1;
  auVar131._16_4_ = 1;
  auVar131._20_4_ = 1;
  auVar131._24_4_ = 1;
  auVar131._28_4_ = 1;
  auVar114 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar128 = ZEXT1632(CONCAT412(fVar232 * auVar111._12_4_,
                                CONCAT48(fVar232 * auVar111._8_4_,
                                         CONCAT44(fVar232 * auVar111._4_4_,fVar169))));
  auVar127 = vpermps_avx2(auVar131,auVar128);
  auVar115 = vpermps_avx512vl(auVar114,auVar128);
  fVar169 = auVar115._0_4_;
  fVar253 = auVar115._4_4_;
  auVar128._4_4_ = fVar253 * auVar120._4_4_;
  auVar128._0_4_ = fVar169 * auVar120._0_4_;
  fVar254 = auVar115._8_4_;
  auVar128._8_4_ = fVar254 * auVar120._8_4_;
  fVar255 = auVar115._12_4_;
  auVar128._12_4_ = fVar255 * auVar120._12_4_;
  fVar262 = auVar115._16_4_;
  auVar128._16_4_ = fVar262 * auVar120._16_4_;
  fVar263 = auVar115._20_4_;
  auVar128._20_4_ = fVar263 * auVar120._20_4_;
  fVar264 = auVar115._24_4_;
  auVar128._24_4_ = fVar264 * auVar120._24_4_;
  auVar128._28_4_ = auVar126._28_4_;
  auVar126._4_4_ = auVar118._4_4_ * fVar253;
  auVar126._0_4_ = auVar118._0_4_ * fVar169;
  auVar126._8_4_ = auVar118._8_4_ * fVar254;
  auVar126._12_4_ = auVar118._12_4_ * fVar255;
  auVar126._16_4_ = auVar118._16_4_ * fVar262;
  auVar126._20_4_ = auVar118._20_4_ * fVar263;
  auVar126._24_4_ = auVar118._24_4_ * fVar264;
  auVar126._28_4_ = auVar116._28_4_;
  auVar116._4_4_ = auVar125._4_4_ * fVar253;
  auVar116._0_4_ = auVar125._0_4_ * fVar169;
  auVar116._8_4_ = auVar125._8_4_ * fVar254;
  auVar116._12_4_ = auVar125._12_4_ * fVar255;
  auVar116._16_4_ = auVar125._16_4_ * fVar262;
  auVar116._20_4_ = auVar125._20_4_ * fVar263;
  auVar116._24_4_ = auVar125._24_4_ * fVar264;
  auVar116._28_4_ = auVar115._28_4_;
  auVar107 = vfmadd231ps_fma(auVar128,auVar127,auVar117);
  auVar26 = vfmadd231ps_fma(auVar126,auVar127,auVar122);
  auVar108 = vfmadd231ps_fma(auVar116,auVar124,auVar127);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar137,auVar119);
  auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar137,auVar121);
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar123,auVar137);
  auVar138._4_4_ = fVar231;
  auVar138._0_4_ = fVar231;
  auVar138._8_4_ = fVar231;
  auVar138._12_4_ = fVar231;
  auVar138._16_4_ = fVar231;
  auVar138._20_4_ = fVar231;
  auVar138._24_4_ = fVar231;
  auVar138._28_4_ = fVar231;
  auVar276 = ZEXT3264(auVar138);
  auVar116 = ZEXT1632(CONCAT412(fVar232 * auVar110._12_4_,
                                CONCAT48(fVar232 * auVar110._8_4_,
                                         CONCAT44(fVar232 * auVar110._4_4_,fVar231))));
  auVar126 = vpermps_avx2(auVar131,auVar116);
  auVar116 = vpermps_avx512vl(auVar114,auVar116);
  fVar232 = auVar116._0_4_;
  fVar169 = auVar116._4_4_;
  auVar127._4_4_ = fVar169 * auVar120._4_4_;
  auVar127._0_4_ = fVar232 * auVar120._0_4_;
  fVar253 = auVar116._8_4_;
  auVar127._8_4_ = fVar253 * auVar120._8_4_;
  fVar254 = auVar116._12_4_;
  auVar127._12_4_ = fVar254 * auVar120._12_4_;
  fVar255 = auVar116._16_4_;
  auVar127._16_4_ = fVar255 * auVar120._16_4_;
  fVar262 = auVar116._20_4_;
  auVar127._20_4_ = fVar262 * auVar120._20_4_;
  fVar263 = auVar116._24_4_;
  auVar127._24_4_ = fVar263 * auVar120._24_4_;
  auVar127._28_4_ = 1;
  auVar114._4_4_ = auVar118._4_4_ * fVar169;
  auVar114._0_4_ = auVar118._0_4_ * fVar232;
  auVar114._8_4_ = auVar118._8_4_ * fVar253;
  auVar114._12_4_ = auVar118._12_4_ * fVar254;
  auVar114._16_4_ = auVar118._16_4_ * fVar255;
  auVar114._20_4_ = auVar118._20_4_ * fVar262;
  auVar114._24_4_ = auVar118._24_4_ * fVar263;
  auVar114._28_4_ = auVar120._28_4_;
  auVar118._4_4_ = auVar125._4_4_ * fVar169;
  auVar118._0_4_ = auVar125._0_4_ * fVar232;
  auVar118._8_4_ = auVar125._8_4_ * fVar253;
  auVar118._12_4_ = auVar125._12_4_ * fVar254;
  auVar118._16_4_ = auVar125._16_4_ * fVar255;
  auVar118._20_4_ = auVar125._20_4_ * fVar262;
  auVar118._24_4_ = auVar125._24_4_ * fVar263;
  auVar118._28_4_ = auVar116._28_4_;
  auVar266 = vfmadd231ps_fma(auVar127,auVar126,auVar117);
  auVar105 = vfmadd231ps_fma(auVar114,auVar126,auVar122);
  auVar6 = vfmadd231ps_fma(auVar118,auVar126,auVar124);
  auVar266 = vfmadd231ps_fma(ZEXT1632(auVar266),auVar138,auVar119);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar138,auVar121);
  auVar134._8_4_ = 0x7fffffff;
  auVar134._0_8_ = 0x7fffffff7fffffff;
  auVar134._12_4_ = 0x7fffffff;
  auVar134._16_4_ = 0x7fffffff;
  auVar134._20_4_ = 0x7fffffff;
  auVar134._24_4_ = 0x7fffffff;
  auVar134._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar138,auVar123);
  auVar119 = vandps_avx(ZEXT1632(auVar107),auVar134);
  auVar136._8_4_ = 0x219392ef;
  auVar136._0_8_ = 0x219392ef219392ef;
  auVar136._12_4_ = 0x219392ef;
  auVar136._16_4_ = 0x219392ef;
  auVar136._20_4_ = 0x219392ef;
  auVar136._24_4_ = 0x219392ef;
  auVar136._28_4_ = 0x219392ef;
  uVar103 = vcmpps_avx512vl(auVar119,auVar136,1);
  bVar12 = (bool)((byte)uVar103 & 1);
  auVar115._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar107._0_4_;
  bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar107._4_4_;
  bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar107._8_4_;
  bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar107._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar103 >> 7) * 0x219392ef;
  auVar119 = vandps_avx(ZEXT1632(auVar26),auVar134);
  uVar103 = vcmpps_avx512vl(auVar119,auVar136,1);
  bVar12 = (bool)((byte)uVar103 & 1);
  auVar129._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._0_4_;
  bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar129._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._4_4_;
  bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar129._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._8_4_;
  bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar129._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._12_4_;
  auVar129._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * 0x219392ef;
  auVar129._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * 0x219392ef;
  auVar129._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * 0x219392ef;
  auVar129._28_4_ = (uint)(byte)(uVar103 >> 7) * 0x219392ef;
  auVar119 = vandps_avx(ZEXT1632(auVar108),auVar134);
  uVar103 = vcmpps_avx512vl(auVar119,auVar136,1);
  bVar12 = (bool)((byte)uVar103 & 1);
  auVar119._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar108._0_4_;
  bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar108._4_4_;
  bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar108._8_4_;
  bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar108._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar103 >> 7) * 0x219392ef;
  auVar117 = vrcp14ps_avx512vl(auVar115);
  auVar135._8_4_ = 0x3f800000;
  auVar135._0_8_ = &DAT_3f8000003f800000;
  auVar135._12_4_ = 0x3f800000;
  auVar135._16_4_ = 0x3f800000;
  auVar135._20_4_ = 0x3f800000;
  auVar135._24_4_ = 0x3f800000;
  auVar135._28_4_ = 0x3f800000;
  auVar107 = vfnmadd213ps_fma(auVar115,auVar117,auVar135);
  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar117,auVar117);
  auVar117 = vrcp14ps_avx512vl(auVar129);
  auVar26 = vfnmadd213ps_fma(auVar129,auVar117,auVar135);
  auVar26 = vfmadd132ps_fma(ZEXT1632(auVar26),auVar117,auVar117);
  auVar117 = vrcp14ps_avx512vl(auVar119);
  auVar108 = vfnmadd213ps_fma(auVar119,auVar117,auVar135);
  auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar117,auVar117);
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 7 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar266));
  auVar123._4_4_ = auVar107._4_4_ * auVar119._4_4_;
  auVar123._0_4_ = auVar107._0_4_ * auVar119._0_4_;
  auVar123._8_4_ = auVar107._8_4_ * auVar119._8_4_;
  auVar123._12_4_ = auVar107._12_4_ * auVar119._12_4_;
  auVar123._16_4_ = auVar119._16_4_ * 0.0;
  auVar123._20_4_ = auVar119._20_4_ * 0.0;
  auVar123._24_4_ = auVar119._24_4_ * 0.0;
  auVar123._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 9 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar266));
  auVar118 = vpbroadcastd_avx512vl();
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar133._0_4_ = auVar107._0_4_ * auVar119._0_4_;
  auVar133._4_4_ = auVar107._4_4_ * auVar119._4_4_;
  auVar133._8_4_ = auVar107._8_4_ * auVar119._8_4_;
  auVar133._12_4_ = auVar107._12_4_ * auVar119._12_4_;
  auVar133._16_4_ = auVar119._16_4_ * 0.0;
  auVar133._20_4_ = auVar119._20_4_ * 0.0;
  auVar133._24_4_ = auVar119._24_4_ * 0.0;
  auVar133._28_4_ = 0;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar7 * 0x10 + uVar96 * -2 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar105));
  auVar124._4_4_ = auVar26._4_4_ * auVar119._4_4_;
  auVar124._0_4_ = auVar26._0_4_ * auVar119._0_4_;
  auVar124._8_4_ = auVar26._8_4_ * auVar119._8_4_;
  auVar124._12_4_ = auVar26._12_4_ * auVar119._12_4_;
  auVar124._16_4_ = auVar119._16_4_ * 0.0;
  auVar124._20_4_ = auVar119._20_4_ * 0.0;
  auVar124._24_4_ = auVar119._24_4_ * 0.0;
  auVar124._28_4_ = auVar119._28_4_;
  auVar119 = vcvtdq2ps_avx(auVar117);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar105));
  auVar132._0_4_ = auVar26._0_4_ * auVar119._0_4_;
  auVar132._4_4_ = auVar26._4_4_ * auVar119._4_4_;
  auVar132._8_4_ = auVar26._8_4_ * auVar119._8_4_;
  auVar132._12_4_ = auVar26._12_4_ * auVar119._12_4_;
  auVar132._16_4_ = auVar119._16_4_ * 0.0;
  auVar132._20_4_ = auVar119._20_4_ * 0.0;
  auVar132._24_4_ = auVar119._24_4_ * 0.0;
  auVar132._28_4_ = 0;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 + uVar96 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar6));
  auVar125._4_4_ = auVar119._4_4_ * auVar108._4_4_;
  auVar125._0_4_ = auVar119._0_4_ * auVar108._0_4_;
  auVar125._8_4_ = auVar119._8_4_ * auVar108._8_4_;
  auVar125._12_4_ = auVar119._12_4_ * auVar108._12_4_;
  auVar125._16_4_ = auVar119._16_4_ * 0.0;
  auVar125._20_4_ = auVar119._20_4_ * 0.0;
  auVar125._24_4_ = auVar119._24_4_ * 0.0;
  auVar125._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 0x17 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar6));
  auVar130._0_4_ = auVar108._0_4_ * auVar119._0_4_;
  auVar130._4_4_ = auVar108._4_4_ * auVar119._4_4_;
  auVar130._8_4_ = auVar108._8_4_ * auVar119._8_4_;
  auVar130._12_4_ = auVar108._12_4_ * auVar119._12_4_;
  auVar130._16_4_ = auVar119._16_4_ * 0.0;
  auVar130._20_4_ = auVar119._20_4_ * 0.0;
  auVar130._24_4_ = auVar119._24_4_ * 0.0;
  auVar130._28_4_ = 0;
  auVar119 = vpminsd_avx2(auVar123,auVar133);
  auVar117 = vpminsd_avx2(auVar124,auVar132);
  auVar119 = vmaxps_avx(auVar119,auVar117);
  auVar117 = vpminsd_avx2(auVar125,auVar130);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar120._4_4_ = uVar5;
  auVar120._0_4_ = uVar5;
  auVar120._8_4_ = uVar5;
  auVar120._12_4_ = uVar5;
  auVar120._16_4_ = uVar5;
  auVar120._20_4_ = uVar5;
  auVar120._24_4_ = uVar5;
  auVar120._28_4_ = uVar5;
  auVar117 = vmaxps_avx512vl(auVar117,auVar120);
  auVar119 = vmaxps_avx(auVar119,auVar117);
  auVar117._8_4_ = 0x3f7ffffa;
  auVar117._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar117._12_4_ = 0x3f7ffffa;
  auVar117._16_4_ = 0x3f7ffffa;
  auVar117._20_4_ = 0x3f7ffffa;
  auVar117._24_4_ = 0x3f7ffffa;
  auVar117._28_4_ = 0x3f7ffffa;
  local_760 = vmulps_avx512vl(auVar119,auVar117);
  auVar119 = vpmaxsd_avx2(auVar123,auVar133);
  auVar117 = vpmaxsd_avx2(auVar124,auVar132);
  auVar119 = vminps_avx(auVar119,auVar117);
  auVar117 = vpmaxsd_avx2(auVar125,auVar130);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar121._4_4_ = uVar5;
  auVar121._0_4_ = uVar5;
  auVar121._8_4_ = uVar5;
  auVar121._12_4_ = uVar5;
  auVar121._16_4_ = uVar5;
  auVar121._20_4_ = uVar5;
  auVar121._24_4_ = uVar5;
  auVar121._28_4_ = uVar5;
  auVar117 = vminps_avx512vl(auVar117,auVar121);
  auVar119 = vminps_avx(auVar119,auVar117);
  auVar122._8_4_ = 0x3f800003;
  auVar122._0_8_ = 0x3f8000033f800003;
  auVar122._12_4_ = 0x3f800003;
  auVar122._16_4_ = 0x3f800003;
  auVar122._20_4_ = 0x3f800003;
  auVar122._24_4_ = 0x3f800003;
  auVar122._28_4_ = 0x3f800003;
  auVar119 = vmulps_avx512vl(auVar119,auVar122);
  uVar29 = vpcmpgtd_avx512vl(auVar118,_DAT_0205a920);
  uVar27 = vcmpps_avx512vl(local_760,auVar119,2);
  if ((byte)((byte)uVar27 & (byte)uVar29) == 0) {
    return;
  }
  local_b08 = (ulong)(byte)((byte)uVar27 & (byte)uVar29);
  pPVar99 = prim + lVar101 + 0x16;
  local_b30 = (undefined1 (*) [32])local_240;
  auVar188 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar188);
  local_b28 = pPVar99;
  local_b20 = prim;
LAB_01d47fd2:
  lVar101 = 0;
  for (uVar103 = local_b08; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
    lVar101 = lVar101 + 1;
  }
  local_b08 = local_b08 - 1 & local_b08;
  uVar5 = *(undefined4 *)(prim + lVar101 * 4 + 6);
  uVar103 = (ulong)(uint)((int)lVar101 << 6);
  auVar107 = *(undefined1 (*) [16])(pPVar99 + uVar103);
  if (local_b08 != 0) {
    uVar96 = local_b08 - 1 & local_b08;
    for (uVar95 = local_b08; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
    }
    if (uVar96 != 0) {
      for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar26 = *(undefined1 (*) [16])(pPVar99 + uVar103 + 0x10);
  auVar108 = *(undefined1 (*) [16])(pPVar99 + uVar103 + 0x20);
  auVar266 = *(undefined1 (*) [16])(pPVar99 + uVar103 + 0x30);
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar6 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_7e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_ae0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar279 = ZEXT3264(local_ae0);
  auVar105 = vunpcklps_avx512vl(local_7e0._0_16_,local_ae0._0_16_);
  local_b00 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar278 = ZEXT3264(local_b00);
  auVar277 = local_b00._0_16_;
  local_a70 = vinsertps_avx512f(auVar105,auVar277,0x28);
  auVar261 = ZEXT1664(local_a70);
  auVar110._0_4_ = auVar107._0_4_ + auVar26._0_4_ + auVar108._0_4_ + auVar266._0_4_;
  auVar110._4_4_ = auVar107._4_4_ + auVar26._4_4_ + auVar108._4_4_ + auVar266._4_4_;
  auVar110._8_4_ = auVar107._8_4_ + auVar26._8_4_ + auVar108._8_4_ + auVar266._8_4_;
  auVar110._12_4_ = auVar107._12_4_ + auVar26._12_4_ + auVar108._12_4_ + auVar266._12_4_;
  auVar111._8_4_ = 0x3e800000;
  auVar111._0_8_ = 0x3e8000003e800000;
  auVar111._12_4_ = 0x3e800000;
  auVar105 = vmulps_avx512vl(auVar110,auVar111);
  auVar105 = vsubps_avx(auVar105,auVar6);
  auVar105 = vdpps_avx(auVar105,local_a70,0x7f);
  fVar232 = *(float *)(ray + k * 4 + 0xc0);
  auVar267 = ZEXT464((uint)fVar232);
  local_a80 = vdpps_avx(local_a70,local_a70,0x7f);
  uVar100 = *(uint *)(prim + 2);
  auVar112._4_12_ = ZEXT812(0) << 0x20;
  auVar112._0_4_ = local_a80._0_4_;
  auVar106 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar112);
  auVar109 = vfnmadd213ss_fma(auVar106,local_a80,ZEXT416(0x40000000));
  local_740 = auVar105._0_4_ * auVar106._0_4_ * auVar109._0_4_;
  auVar251 = ZEXT464((uint)local_740);
  auVar113._4_4_ = local_740;
  auVar113._0_4_ = local_740;
  auVar113._8_4_ = local_740;
  auVar113._12_4_ = local_740;
  fStack_930 = local_740;
  _local_940 = auVar113;
  fStack_92c = local_740;
  fStack_928 = local_740;
  fStack_924 = local_740;
  auVar105 = vfmadd231ps_fma(auVar6,local_a70,auVar113);
  auVar105 = vblendps_avx(auVar105,ZEXT816(0) << 0x40,8);
  auVar107 = vsubps_avx(auVar107,auVar105);
  auVar108 = vsubps_avx(auVar108,auVar105);
  auVar26 = vsubps_avx(auVar26,auVar105);
  auVar260 = ZEXT1664(auVar26);
  auVar266 = vsubps_avx(auVar266,auVar105);
  local_520 = auVar107._0_4_;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  auVar139._8_4_ = 1;
  auVar139._0_8_ = 0x100000001;
  auVar139._12_4_ = 1;
  auVar139._16_4_ = 1;
  auVar139._20_4_ = 1;
  auVar139._24_4_ = 1;
  auVar139._28_4_ = 1;
  local_a00 = ZEXT1632(auVar107);
  local_540 = vpermps_avx2(auVar139,local_a00);
  auVar140._8_4_ = 2;
  auVar140._0_8_ = 0x200000002;
  auVar140._12_4_ = 2;
  auVar140._16_4_ = 2;
  auVar140._20_4_ = 2;
  auVar140._24_4_ = 2;
  auVar140._28_4_ = 2;
  local_560 = vpermps_avx2(auVar140,local_a00);
  auVar143._8_4_ = 3;
  auVar143._0_8_ = 0x300000003;
  auVar143._12_4_ = 3;
  auVar143._16_4_ = 3;
  auVar143._20_4_ = 3;
  auVar143._24_4_ = 3;
  auVar143._28_4_ = 3;
  local_580 = vpermps_avx2(auVar143,local_a00);
  local_5a0 = auVar26._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  local_a40 = ZEXT1632(auVar26);
  local_5c0 = vpermps_avx2(auVar139,local_a40);
  local_5e0 = vpermps_avx2(auVar140,local_a40);
  local_600 = vpermps_avx2(auVar143,local_a40);
  local_620 = auVar108._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_a20 = ZEXT1632(auVar108);
  local_640 = vpermps_avx2(auVar139,local_a20);
  local_660 = vpermps_avx2(auVar140,local_a20);
  local_680 = vpermps_avx2(auVar143,local_a20);
  local_6a0 = auVar266._0_4_;
  uStack_69c = local_6a0;
  uStack_698 = local_6a0;
  uStack_694 = local_6a0;
  uStack_690 = local_6a0;
  uStack_68c = local_6a0;
  uStack_688 = local_6a0;
  uStack_684 = local_6a0;
  _local_a60 = ZEXT1632(auVar266);
  local_6c0 = vpermps_avx2(auVar139,_local_a60);
  local_6e0 = vpermps_avx2(auVar140,_local_a60);
  local_700 = vpermps_avx2(auVar143,_local_a60);
  auVar107 = vmulss_avx512f(auVar277,auVar277);
  auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),local_ae0,local_ae0);
  local_800 = vfmadd231ps_avx512vl(auVar119,local_7e0,local_7e0);
  local_720._0_4_ = local_800._0_4_;
  local_720._4_4_ = local_720._0_4_;
  local_720._8_4_ = local_720._0_4_;
  local_720._12_4_ = local_720._0_4_;
  local_720._16_4_ = local_720._0_4_;
  local_720._20_4_ = local_720._0_4_;
  local_720._24_4_ = local_720._0_4_;
  local_720._28_4_ = local_720._0_4_;
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar225._16_4_ = 0x7fffffff;
  auVar225._20_4_ = 0x7fffffff;
  auVar225._24_4_ = 0x7fffffff;
  auVar225._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_720,auVar225);
  local_9c0 = ZEXT416((uint)local_740);
  local_740 = fVar232 - local_740;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar188 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar188);
  local_b18 = 1;
  local_b10 = 0;
  auVar188 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar188);
  auVar107 = vsqrtss_avx(local_a80,local_a80);
  auVar26 = vsqrtss_avx(local_a80,local_a80);
  auVar227 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar117 = auVar188._32_32_;
  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar188 = ZEXT3264(auVar119);
  do {
    local_b40 = auVar227._0_16_;
    auVar108 = vmovshdup_avx(local_b40);
    fVar169 = auVar227._0_4_;
    fVar270 = auVar108._0_4_ - fVar169;
    fVar214 = fVar270 * 0.04761905;
    auVar245._4_4_ = fVar169;
    auVar245._0_4_ = fVar169;
    auVar245._8_4_ = fVar169;
    auVar245._12_4_ = fVar169;
    auVar245._16_4_ = fVar169;
    auVar245._20_4_ = fVar169;
    auVar245._24_4_ = fVar169;
    auVar245._28_4_ = fVar169;
    local_aa0._4_4_ = fVar270;
    local_aa0._0_4_ = fVar270;
    local_aa0._8_4_ = fVar270;
    local_aa0._12_4_ = fVar270;
    local_aa0._16_4_ = fVar270;
    local_aa0._20_4_ = fVar270;
    local_aa0._24_4_ = fVar270;
    local_aa0._28_4_ = fVar270;
    auVar108 = vfmadd231ps_fma(auVar245,local_aa0,_DAT_02020f20);
    auVar120 = vsubps_avx512vl(auVar188._0_32_,ZEXT1632(auVar108));
    fVar169 = auVar120._0_4_;
    fVar254 = auVar120._4_4_;
    fVar262 = auVar120._8_4_;
    fVar264 = auVar120._12_4_;
    fVar256 = auVar120._16_4_;
    fVar250 = auVar120._20_4_;
    fVar265 = auVar120._24_4_;
    fVar170 = fVar169 * fVar169 * fVar169;
    fVar189 = fVar254 * fVar254 * fVar254;
    auVar44._4_4_ = fVar189;
    auVar44._0_4_ = fVar170;
    fVar190 = fVar262 * fVar262 * fVar262;
    auVar44._8_4_ = fVar190;
    fVar191 = fVar264 * fVar264 * fVar264;
    auVar44._12_4_ = fVar191;
    fVar192 = fVar256 * fVar256 * fVar256;
    auVar44._16_4_ = fVar192;
    fVar193 = fVar250 * fVar250 * fVar250;
    auVar44._20_4_ = fVar193;
    fVar194 = fVar265 * fVar265 * fVar265;
    auVar44._24_4_ = fVar194;
    auVar44._28_4_ = fVar270;
    auVar118 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar119 = vmulps_avx512vl(auVar44,auVar118);
    fVar253 = auVar108._0_4_;
    fVar255 = auVar108._4_4_;
    fVar263 = auVar108._8_4_;
    fVar231 = auVar108._12_4_;
    fVar213 = fVar253 * fVar253 * fVar253;
    fVar228 = fVar255 * fVar255 * fVar255;
    fVar229 = fVar263 * fVar263 * fVar263;
    fVar230 = fVar231 * fVar231 * fVar231;
    auVar188._28_36_ = auVar227._28_36_;
    auVar188._0_28_ = ZEXT1628(CONCAT412(fVar230,CONCAT48(fVar229,CONCAT44(fVar228,fVar213))));
    auVar227._0_4_ = fVar253 * fVar169;
    auVar227._4_4_ = fVar255 * fVar254;
    auVar227._8_4_ = fVar263 * fVar262;
    auVar227._12_4_ = fVar231 * fVar264;
    auVar227._16_4_ = fVar256 * 0.0;
    auVar227._20_4_ = fVar250 * 0.0;
    auVar227._28_36_ = auVar267._28_36_;
    auVar227._24_4_ = fVar265 * 0.0;
    auVar121 = vmulps_avx512vl(auVar188._0_32_,auVar118);
    fVar270 = auVar121._28_4_ + fVar270;
    auVar45._4_4_ = fVar189 * 0.16666667;
    auVar45._0_4_ = fVar170 * 0.16666667;
    auVar45._8_4_ = fVar190 * 0.16666667;
    auVar45._12_4_ = fVar191 * 0.16666667;
    auVar45._16_4_ = fVar192 * 0.16666667;
    auVar45._20_4_ = fVar193 * 0.16666667;
    auVar45._24_4_ = fVar194 * 0.16666667;
    auVar45._28_4_ = fVar270;
    auVar46._4_4_ =
         (auVar227._4_4_ * fVar254 * 12.0 + auVar227._4_4_ * fVar255 * 6.0 +
         fVar228 + auVar119._4_4_) * 0.16666667;
    auVar46._0_4_ =
         (auVar227._0_4_ * fVar169 * 12.0 + auVar227._0_4_ * fVar253 * 6.0 +
         fVar213 + auVar119._0_4_) * 0.16666667;
    auVar46._8_4_ =
         (auVar227._8_4_ * fVar262 * 12.0 + auVar227._8_4_ * fVar263 * 6.0 +
         fVar229 + auVar119._8_4_) * 0.16666667;
    auVar46._12_4_ =
         (auVar227._12_4_ * fVar264 * 12.0 + auVar227._12_4_ * fVar231 * 6.0 +
         fVar230 + auVar119._12_4_) * 0.16666667;
    auVar46._16_4_ =
         (auVar227._16_4_ * fVar256 * 12.0 + auVar227._16_4_ * 0.0 * 6.0 + auVar119._16_4_ + 0.0) *
         0.16666667;
    auVar46._20_4_ =
         (auVar227._20_4_ * fVar250 * 12.0 + auVar227._20_4_ * 0.0 * 6.0 + auVar119._20_4_ + 0.0) *
         0.16666667;
    auVar46._24_4_ =
         (auVar227._24_4_ * fVar265 * 12.0 + auVar227._24_4_ * 0.0 * 6.0 + auVar119._24_4_ + 0.0) *
         0.16666667;
    auVar46._28_4_ = auVar272._28_4_;
    auVar47._4_4_ =
         (auVar121._4_4_ + fVar189 +
         auVar227._4_4_ * fVar255 * 12.0 + auVar227._4_4_ * fVar254 * 6.0) * 0.16666667;
    auVar47._0_4_ =
         (auVar121._0_4_ + fVar170 +
         auVar227._0_4_ * fVar253 * 12.0 + auVar227._0_4_ * fVar169 * 6.0) * 0.16666667;
    auVar47._8_4_ =
         (auVar121._8_4_ + fVar190 +
         auVar227._8_4_ * fVar263 * 12.0 + auVar227._8_4_ * fVar262 * 6.0) * 0.16666667;
    auVar47._12_4_ =
         (auVar121._12_4_ + fVar191 +
         auVar227._12_4_ * fVar231 * 12.0 + auVar227._12_4_ * fVar264 * 6.0) * 0.16666667;
    auVar47._16_4_ =
         (auVar121._16_4_ + fVar192 + auVar227._16_4_ * 0.0 * 12.0 + auVar227._16_4_ * fVar256 * 6.0
         ) * 0.16666667;
    auVar47._20_4_ =
         (auVar121._20_4_ + fVar193 + auVar227._20_4_ * 0.0 * 12.0 + auVar227._20_4_ * fVar250 * 6.0
         ) * 0.16666667;
    auVar47._24_4_ =
         (auVar121._24_4_ + fVar194 + auVar227._24_4_ * 0.0 * 12.0 + auVar227._24_4_ * fVar265 * 6.0
         ) * 0.16666667;
    auVar47._28_4_ = auVar276._28_4_;
    auVar48._28_4_ = fVar270 + auVar272._28_4_ + auVar251._28_4_;
    auVar48._0_28_ =
         ZEXT1628(CONCAT412(fVar230 * 0.16666667,
                            CONCAT48(fVar229 * 0.16666667,
                                     CONCAT44(fVar228 * 0.16666667,fVar213 * 0.16666667))));
    auVar87._4_4_ = uStack_69c;
    auVar87._0_4_ = local_6a0;
    auVar87._8_4_ = uStack_698;
    auVar87._12_4_ = uStack_694;
    auVar87._16_4_ = uStack_690;
    auVar87._20_4_ = uStack_68c;
    auVar87._24_4_ = uStack_688;
    auVar87._28_4_ = uStack_684;
    auVar119 = vmulps_avx512vl(auVar87,auVar48);
    auVar121 = vmulps_avx512vl(local_6c0,auVar48);
    auVar122 = vmulps_avx512vl(local_6e0,auVar48);
    auVar123 = vmulps_avx512vl(local_700,auVar48);
    auVar88._4_4_ = uStack_61c;
    auVar88._0_4_ = local_620;
    auVar88._8_4_ = uStack_618;
    auVar88._12_4_ = uStack_614;
    auVar88._16_4_ = uStack_610;
    auVar88._20_4_ = uStack_60c;
    auVar88._24_4_ = uStack_608;
    auVar88._28_4_ = uStack_604;
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar47,auVar88);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar47,local_640);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar47,local_660);
    auVar123 = vfmadd231ps_avx512vl(auVar123,local_680,auVar47);
    auVar89._4_4_ = uStack_59c;
    auVar89._0_4_ = local_5a0;
    auVar89._8_4_ = uStack_598;
    auVar89._12_4_ = uStack_594;
    auVar89._16_4_ = uStack_590;
    auVar89._20_4_ = uStack_58c;
    auVar89._24_4_ = uStack_588;
    auVar89._28_4_ = uStack_584;
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar46,auVar89);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar46,local_5c0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar46,local_5e0);
    auVar123 = vfmadd231ps_avx512vl(auVar123,local_600,auVar46);
    auVar90._4_4_ = fStack_51c;
    auVar90._0_4_ = local_520;
    auVar90._8_4_ = fStack_518;
    auVar90._12_4_ = fStack_514;
    auVar90._16_4_ = fStack_510;
    auVar90._20_4_ = fStack_50c;
    auVar90._24_4_ = fStack_508;
    auVar90._28_4_ = fStack_504;
    auVar266 = vfmadd231ps_fma(auVar119,auVar45,auVar90);
    auVar105 = vfmadd231ps_fma(auVar121,auVar45,local_540);
    auVar6 = vfmadd231ps_fma(auVar122,auVar45,local_560);
    auVar109 = vfmadd231ps_fma(auVar123,local_580,auVar45);
    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar121 = vxorps_avx512vl(auVar120,auVar119);
    auVar122 = vxorps_avx512vl(ZEXT1632(auVar108),auVar119);
    auVar246._0_4_ = auVar122._0_4_ * fVar253;
    auVar246._4_4_ = auVar122._4_4_ * fVar255;
    auVar246._8_4_ = auVar122._8_4_ * fVar263;
    auVar246._12_4_ = auVar122._12_4_ * fVar231;
    auVar246._16_4_ = auVar122._16_4_ * 0.0;
    auVar246._20_4_ = auVar122._20_4_ * 0.0;
    auVar246._24_4_ = auVar122._24_4_ * 0.0;
    auVar246._28_4_ = 0;
    auVar123 = vmulps_avx512vl(auVar227._0_32_,auVar118);
    auVar119 = vsubps_avx(auVar246,auVar123);
    auVar49._4_4_ = auVar121._4_4_ * fVar254 * 0.5;
    auVar49._0_4_ = auVar121._0_4_ * fVar169 * 0.5;
    auVar49._8_4_ = auVar121._8_4_ * fVar262 * 0.5;
    auVar49._12_4_ = auVar121._12_4_ * fVar264 * 0.5;
    auVar49._16_4_ = auVar121._16_4_ * fVar256 * 0.5;
    auVar49._20_4_ = auVar121._20_4_ * fVar250 * 0.5;
    auVar49._24_4_ = auVar121._24_4_ * fVar265 * 0.5;
    auVar49._28_4_ = auVar120._28_4_;
    auVar50._4_4_ = auVar119._4_4_ * 0.5;
    auVar50._0_4_ = auVar119._0_4_ * 0.5;
    auVar50._8_4_ = auVar119._8_4_ * 0.5;
    auVar50._12_4_ = auVar119._12_4_ * 0.5;
    auVar50._16_4_ = auVar119._16_4_ * 0.5;
    auVar50._20_4_ = auVar119._20_4_ * 0.5;
    auVar50._24_4_ = auVar119._24_4_ * 0.5;
    auVar50._28_4_ = auVar119._28_4_;
    auVar51._4_4_ = (fVar254 * fVar254 + auVar123._4_4_) * 0.5;
    auVar51._0_4_ = (fVar169 * fVar169 + auVar123._0_4_) * 0.5;
    auVar51._8_4_ = (fVar262 * fVar262 + auVar123._8_4_) * 0.5;
    auVar51._12_4_ = (fVar264 * fVar264 + auVar123._12_4_) * 0.5;
    auVar51._16_4_ = (fVar256 * fVar256 + auVar123._16_4_) * 0.5;
    auVar51._20_4_ = (fVar250 * fVar250 + auVar123._20_4_) * 0.5;
    auVar51._24_4_ = (fVar265 * fVar265 + auVar123._24_4_) * 0.5;
    auVar51._28_4_ = auVar260._28_4_ + auVar123._28_4_;
    auVar52._28_4_ = auVar261._28_4_;
    auVar52._0_28_ =
         ZEXT1628(CONCAT412(fVar231 * fVar231 * 0.5,
                            CONCAT48(fVar263 * fVar263 * 0.5,
                                     CONCAT44(fVar255 * fVar255 * 0.5,fVar253 * fVar253 * 0.5))));
    auVar119 = vmulps_avx512vl(auVar87,auVar52);
    auVar120 = vmulps_avx512vl(local_6c0,auVar52);
    auVar121 = vmulps_avx512vl(local_6e0,auVar52);
    auVar123 = vmulps_avx512vl(local_700,auVar52);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar51,auVar88);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar51,local_640);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar51,local_660);
    auVar123 = vfmadd231ps_avx512vl(auVar123,local_680,auVar51);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar50,auVar89);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar50,local_5c0);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar50,local_5e0);
    auVar123 = vfmadd231ps_avx512vl(auVar123,local_600,auVar50);
    auVar108 = vfmadd231ps_fma(auVar119,auVar49,auVar90);
    auVar106 = vfmadd231ps_fma(auVar120,auVar49,local_540);
    auVar277 = vfmadd231ps_fma(auVar121,auVar49,local_560);
    auVar111 = vfmadd231ps_fma(auVar123,local_580,auVar49);
    auVar53._4_4_ = auVar108._4_4_ * fVar214;
    auVar53._0_4_ = auVar108._0_4_ * fVar214;
    auVar53._8_4_ = auVar108._8_4_ * fVar214;
    auVar53._12_4_ = auVar108._12_4_ * fVar214;
    auVar53._16_4_ = fVar214 * 0.0;
    auVar53._20_4_ = fVar214 * 0.0;
    auVar53._24_4_ = fVar214 * 0.0;
    auVar53._28_4_ = auVar122._28_4_;
    auVar271._0_4_ = auVar106._0_4_ * fVar214;
    auVar271._4_4_ = auVar106._4_4_ * fVar214;
    auVar271._8_4_ = auVar106._8_4_ * fVar214;
    auVar271._12_4_ = auVar106._12_4_ * fVar214;
    auVar271._16_4_ = fVar214 * 0.0;
    auVar271._20_4_ = fVar214 * 0.0;
    auVar271._24_4_ = fVar214 * 0.0;
    auVar271._28_4_ = 0;
    auVar272 = ZEXT3264(auVar271);
    auVar275._0_4_ = auVar277._0_4_ * fVar214;
    auVar275._4_4_ = auVar277._4_4_ * fVar214;
    auVar275._8_4_ = auVar277._8_4_ * fVar214;
    auVar275._12_4_ = auVar277._12_4_ * fVar214;
    auVar275._16_4_ = fVar214 * 0.0;
    auVar275._20_4_ = fVar214 * 0.0;
    auVar275._24_4_ = fVar214 * 0.0;
    auVar275._28_4_ = 0;
    auVar276 = ZEXT3264(auVar275);
    fVar169 = auVar111._0_4_ * fVar214;
    fVar253 = auVar111._4_4_ * fVar214;
    auVar54._4_4_ = fVar253;
    auVar54._0_4_ = fVar169;
    fVar254 = auVar111._8_4_ * fVar214;
    auVar54._8_4_ = fVar254;
    fVar255 = auVar111._12_4_ * fVar214;
    auVar54._12_4_ = fVar255;
    auVar54._16_4_ = fVar214 * 0.0;
    auVar54._20_4_ = fVar214 * 0.0;
    auVar54._24_4_ = fVar214 * 0.0;
    auVar54._28_4_ = fStack_504;
    auVar108 = vxorps_avx512vl(auVar279._0_16_,auVar279._0_16_);
    auVar123 = vpermt2ps_avx512vl(ZEXT1632(auVar266),_DAT_0205fd20,ZEXT1632(auVar108));
    auVar260 = ZEXT3264(auVar123);
    auVar124 = vpermt2ps_avx512vl(ZEXT1632(auVar105),_DAT_0205fd20,ZEXT1632(auVar108));
    auVar261 = ZEXT3264(auVar124);
    auVar121 = ZEXT1632(auVar108);
    auVar125 = vpermt2ps_avx512vl(ZEXT1632(auVar6),_DAT_0205fd20,auVar121);
    auVar267 = ZEXT3264(auVar125);
    auVar247._0_4_ = fVar169 + auVar109._0_4_;
    auVar247._4_4_ = fVar253 + auVar109._4_4_;
    auVar247._8_4_ = fVar254 + auVar109._8_4_;
    auVar247._12_4_ = fVar255 + auVar109._12_4_;
    auVar247._16_4_ = fVar214 * 0.0 + 0.0;
    auVar247._20_4_ = fVar214 * 0.0 + 0.0;
    auVar247._24_4_ = fVar214 * 0.0 + 0.0;
    auVar247._28_4_ = fStack_504 + 0.0;
    auVar119 = vmaxps_avx(ZEXT1632(auVar109),auVar247);
    auVar120 = vminps_avx(ZEXT1632(auVar109),auVar247);
    auVar126 = vpermt2ps_avx512vl(ZEXT1632(auVar109),_DAT_0205fd20,auVar121);
    auVar116 = vpermt2ps_avx512vl(auVar53,_DAT_0205fd20,auVar121);
    auVar127 = vpermt2ps_avx512vl(auVar271,_DAT_0205fd20,auVar121);
    auVar139 = ZEXT1632(auVar108);
    auVar128 = vpermt2ps_avx512vl(auVar275,_DAT_0205fd20,auVar139);
    auVar251 = ZEXT3264(auVar128);
    auVar121 = vpermt2ps_avx512vl(auVar54,_DAT_0205fd20,auVar139);
    auVar114 = vsubps_avx512vl(auVar126,auVar121);
    auVar121 = vsubps_avx(auVar123,ZEXT1632(auVar266));
    auVar122 = vsubps_avx(auVar124,ZEXT1632(auVar105));
    local_920 = vsubps_avx512vl(auVar125,ZEXT1632(auVar6));
    auVar115 = vmulps_avx512vl(auVar122,auVar275);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar271,local_920);
    auVar129 = vmulps_avx512vl(local_920,auVar53);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar275,auVar121);
    auVar130 = vmulps_avx512vl(auVar121,auVar271);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar53,auVar122);
    auVar130 = vmulps_avx512vl(auVar130,auVar130);
    auVar129 = vfmadd231ps_avx512vl(auVar130,auVar129,auVar129);
    auVar115 = vfmadd231ps_avx512vl(auVar129,auVar115,auVar115);
    auVar129 = vmulps_avx512vl(local_920,local_920);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar122,auVar122);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar121,auVar121);
    auVar130 = vrcp14ps_avx512vl(auVar129);
    auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar132 = vfnmadd213ps_avx512vl(auVar130,auVar129,auVar131);
    auVar130 = vfmadd132ps_avx512vl(auVar132,auVar130,auVar130);
    auVar115 = vmulps_avx512vl(auVar115,auVar130);
    auVar132 = vmulps_avx512vl(auVar122,auVar128);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar127,local_920);
    auVar133 = vmulps_avx512vl(local_920,auVar116);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar128,auVar121);
    auVar134 = vmulps_avx512vl(auVar121,auVar127);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar116,auVar122);
    auVar134 = vmulps_avx512vl(auVar134,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar133,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar132);
    auVar130 = vmulps_avx512vl(auVar132,auVar130);
    auVar115 = vmaxps_avx512vl(auVar115,auVar130);
    auVar115 = vsqrtps_avx512vl(auVar115);
    auVar130 = vmaxps_avx512vl(auVar114,auVar126);
    auVar119 = vmaxps_avx512vl(auVar119,auVar130);
    auVar130 = vaddps_avx512vl(auVar115,auVar119);
    auVar119 = vminps_avx512vl(auVar114,auVar126);
    auVar119 = vminps_avx(auVar120,auVar119);
    auVar119 = vsubps_avx512vl(auVar119,auVar115);
    auVar144._8_4_ = 0x3f800002;
    auVar144._0_8_ = 0x3f8000023f800002;
    auVar144._12_4_ = 0x3f800002;
    auVar144._16_4_ = 0x3f800002;
    auVar144._20_4_ = 0x3f800002;
    auVar144._24_4_ = 0x3f800002;
    auVar144._28_4_ = 0x3f800002;
    auVar120 = vmulps_avx512vl(auVar130,auVar144);
    auVar145._8_4_ = 0x3f7ffffc;
    auVar145._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar145._12_4_ = 0x3f7ffffc;
    auVar145._16_4_ = 0x3f7ffffc;
    auVar145._20_4_ = 0x3f7ffffc;
    auVar145._24_4_ = 0x3f7ffffc;
    auVar145._28_4_ = 0x3f7ffffc;
    auVar126 = vmulps_avx512vl(auVar119,auVar145);
    auVar55._4_4_ = auVar120._4_4_ * auVar120._4_4_;
    auVar55._0_4_ = auVar120._0_4_ * auVar120._0_4_;
    auVar55._8_4_ = auVar120._8_4_ * auVar120._8_4_;
    auVar55._12_4_ = auVar120._12_4_ * auVar120._12_4_;
    auVar55._16_4_ = auVar120._16_4_ * auVar120._16_4_;
    auVar55._20_4_ = auVar120._20_4_ * auVar120._20_4_;
    auVar55._24_4_ = auVar120._24_4_ * auVar120._24_4_;
    auVar55._28_4_ = auVar126._28_4_;
    auVar119 = vrsqrt14ps_avx512vl(auVar129);
    auVar146._8_4_ = 0xbf000000;
    auVar146._0_8_ = 0xbf000000bf000000;
    auVar146._12_4_ = 0xbf000000;
    auVar146._16_4_ = 0xbf000000;
    auVar146._20_4_ = 0xbf000000;
    auVar146._24_4_ = 0xbf000000;
    auVar146._28_4_ = 0xbf000000;
    auVar120 = vmulps_avx512vl(auVar129,auVar146);
    auVar56._4_4_ = auVar119._4_4_ * auVar120._4_4_;
    auVar56._0_4_ = auVar119._0_4_ * auVar120._0_4_;
    auVar56._8_4_ = auVar119._8_4_ * auVar120._8_4_;
    auVar56._12_4_ = auVar119._12_4_ * auVar120._12_4_;
    auVar56._16_4_ = auVar119._16_4_ * auVar120._16_4_;
    auVar56._20_4_ = auVar119._20_4_ * auVar120._20_4_;
    auVar56._24_4_ = auVar119._24_4_ * auVar120._24_4_;
    auVar56._28_4_ = auVar120._28_4_;
    auVar120 = vmulps_avx512vl(auVar119,auVar119);
    auVar120 = vmulps_avx512vl(auVar120,auVar56);
    auVar32._8_4_ = 0x3fc00000;
    auVar32._0_8_ = 0x3fc000003fc00000;
    auVar32._12_4_ = 0x3fc00000;
    auVar32._16_4_ = 0x3fc00000;
    auVar32._20_4_ = 0x3fc00000;
    auVar32._24_4_ = 0x3fc00000;
    auVar32._28_4_ = 0x3fc00000;
    auVar114 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar32);
    auVar57._4_4_ = auVar114._4_4_ * auVar121._4_4_;
    auVar57._0_4_ = auVar114._0_4_ * auVar121._0_4_;
    auVar57._8_4_ = auVar114._8_4_ * auVar121._8_4_;
    auVar57._12_4_ = auVar114._12_4_ * auVar121._12_4_;
    auVar57._16_4_ = auVar114._16_4_ * auVar121._16_4_;
    auVar57._20_4_ = auVar114._20_4_ * auVar121._20_4_;
    auVar57._24_4_ = auVar114._24_4_ * auVar121._24_4_;
    auVar57._28_4_ = auVar119._28_4_;
    auVar119 = vmulps_avx512vl(auVar122,auVar114);
    auVar120 = vmulps_avx512vl(local_920,auVar114);
    local_b60 = ZEXT1632(auVar266);
    auVar115 = vsubps_avx512vl(auVar139,local_b60);
    auVar225 = ZEXT1632(auVar105);
    auVar129 = vsubps_avx512vl(auVar139,auVar225);
    local_ac0 = ZEXT1632(auVar6);
    auVar130 = vsubps_avx512vl(auVar139,local_ac0);
    auVar132 = vmulps_avx512vl(auVar278._0_32_,auVar130);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar279._0_32_,auVar129);
    auVar132 = vfmadd231ps_avx512vl(auVar132,local_7e0,auVar115);
    auVar133 = vmulps_avx512vl(auVar130,auVar130);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar129,auVar129);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar115,auVar115);
    auVar134 = vmulps_avx512vl(auVar278._0_32_,auVar120);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar119,auVar279._0_32_);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar57,local_7e0);
    auVar120 = vmulps_avx512vl(auVar130,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar129,auVar119);
    auVar135 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar57);
    auVar136 = vmulps_avx512vl(auVar134,auVar134);
    auVar119 = vsubps_avx(local_720,auVar136);
    auVar120 = vmulps_avx512vl(auVar134,auVar135);
    auVar120 = vsubps_avx512vl(auVar132,auVar120);
    auVar132 = vaddps_avx512vl(auVar120,auVar120);
    auVar120 = vmulps_avx512vl(auVar135,auVar135);
    auVar133 = vsubps_avx512vl(auVar133,auVar120);
    auVar120 = vsubps_avx(auVar133,auVar55);
    auVar137 = vmulps_avx512vl(auVar132,auVar132);
    auVar118 = vmulps_avx512vl(auVar119,auVar118);
    auVar138 = vmulps_avx512vl(auVar118,auVar120);
    auVar138 = vsubps_avx512vl(auVar137,auVar138);
    uVar103 = vcmpps_avx512vl(auVar138,auVar139,5);
    bVar91 = (byte)uVar103;
    if (bVar91 == 0) {
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar142 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar138 = vsqrtps_avx512vl(auVar138);
      auVar139 = vaddps_avx512vl(auVar119,auVar119);
      auVar140 = vrcp14ps_avx512vl(auVar139);
      auVar131 = vfnmadd213ps_avx512vl(auVar139,auVar140,auVar131);
      auVar131 = vfmadd132ps_avx512vl(auVar131,auVar140,auVar140);
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      auVar33._16_4_ = 0x80000000;
      auVar33._20_4_ = 0x80000000;
      auVar33._24_4_ = 0x80000000;
      auVar33._28_4_ = 0x80000000;
      auVar139 = vxorps_avx512vl(auVar132,auVar33);
      auVar139 = vsubps_avx512vl(auVar139,auVar138);
      auVar139 = vmulps_avx512vl(auVar139,auVar131);
      auVar138 = vsubps_avx512vl(auVar138,auVar132);
      auVar138 = vmulps_avx512vl(auVar138,auVar131);
      auVar131 = vfmadd213ps_avx512vl(auVar134,auVar139,auVar135);
      local_840 = vmulps_avx512vl(auVar114,auVar131);
      auVar131 = vfmadd213ps_avx512vl(auVar134,auVar138,auVar135);
      local_860 = vmulps_avx512vl(auVar114,auVar131);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar131 = vblendmps_avx512vl(auVar131,auVar139);
      auVar141._0_4_ =
           (uint)(bVar91 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar91 & 1) * local_860._0_4_;
      bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar141._4_4_ = (uint)bVar12 * auVar131._4_4_ | (uint)!bVar12 * local_860._4_4_;
      bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar141._8_4_ = (uint)bVar12 * auVar131._8_4_ | (uint)!bVar12 * local_860._8_4_;
      bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar141._12_4_ = (uint)bVar12 * auVar131._12_4_ | (uint)!bVar12 * local_860._12_4_;
      bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
      auVar141._16_4_ = (uint)bVar12 * auVar131._16_4_ | (uint)!bVar12 * local_860._16_4_;
      bVar12 = (bool)((byte)(uVar103 >> 5) & 1);
      auVar141._20_4_ = (uint)bVar12 * auVar131._20_4_ | (uint)!bVar12 * local_860._20_4_;
      bVar12 = (bool)((byte)(uVar103 >> 6) & 1);
      auVar141._24_4_ = (uint)bVar12 * auVar131._24_4_ | (uint)!bVar12 * local_860._24_4_;
      bVar12 = SUB81(uVar103 >> 7,0);
      auVar141._28_4_ = (uint)bVar12 * auVar131._28_4_ | (uint)!bVar12 * local_860._28_4_;
      auVar237._8_4_ = 0xff800000;
      auVar237._0_8_ = 0xff800000ff800000;
      auVar237._12_4_ = 0xff800000;
      auVar237._16_4_ = 0xff800000;
      auVar237._20_4_ = 0xff800000;
      auVar237._24_4_ = 0xff800000;
      auVar237._28_4_ = 0xff800000;
      auVar131 = vblendmps_avx512vl(auVar237,auVar138);
      auVar142._0_4_ =
           (uint)(bVar91 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar138._0_4_;
      bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
      auVar142._4_4_ = (uint)bVar12 * auVar131._4_4_ | (uint)!bVar12 * auVar138._4_4_;
      bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
      auVar142._8_4_ = (uint)bVar12 * auVar131._8_4_ | (uint)!bVar12 * auVar138._8_4_;
      bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
      auVar142._12_4_ = (uint)bVar12 * auVar131._12_4_ | (uint)!bVar12 * auVar138._12_4_;
      bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
      auVar142._16_4_ = (uint)bVar12 * auVar131._16_4_ | (uint)!bVar12 * auVar138._16_4_;
      bVar12 = (bool)((byte)(uVar103 >> 5) & 1);
      auVar142._20_4_ = (uint)bVar12 * auVar131._20_4_ | (uint)!bVar12 * auVar138._20_4_;
      bVar12 = (bool)((byte)(uVar103 >> 6) & 1);
      auVar142._24_4_ = (uint)bVar12 * auVar131._24_4_ | (uint)!bVar12 * auVar138._24_4_;
      bVar12 = SUB81(uVar103 >> 7,0);
      auVar142._28_4_ = (uint)bVar12 * auVar131._28_4_ | (uint)!bVar12 * auVar138._28_4_;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar136,auVar138);
      auVar131 = vmaxps_avx512vl(local_800,auVar138);
      auVar34._8_4_ = 0x36000000;
      auVar34._0_8_ = 0x3600000036000000;
      auVar34._12_4_ = 0x36000000;
      auVar34._16_4_ = 0x36000000;
      auVar34._20_4_ = 0x36000000;
      auVar34._24_4_ = 0x36000000;
      auVar34._28_4_ = 0x36000000;
      auVar131 = vmulps_avx512vl(auVar131,auVar34);
      vandps_avx512vl(auVar119,auVar138);
      uVar95 = vcmpps_avx512vl(auVar131,auVar131,1);
      uVar103 = uVar103 & uVar95;
      bVar98 = (byte)uVar103;
      if (bVar98 != 0) {
        uVar95 = vcmpps_avx512vl(auVar120,_DAT_02020f00,2);
        auVar249._8_4_ = 0xff800000;
        auVar249._0_8_ = 0xff800000ff800000;
        auVar249._12_4_ = 0xff800000;
        auVar249._16_4_ = 0xff800000;
        auVar249._20_4_ = 0xff800000;
        auVar249._24_4_ = 0xff800000;
        auVar249._28_4_ = 0xff800000;
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar138 = vblendmps_avx512vl(auVar120,auVar249);
        bVar94 = (byte)uVar95;
        uVar104 = (uint)(bVar94 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar94 & 1) * auVar131._0_4_;
        bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
        uVar162 = (uint)bVar12 * auVar138._4_4_ | (uint)!bVar12 * auVar131._4_4_;
        bVar12 = (bool)((byte)(uVar95 >> 2) & 1);
        uVar163 = (uint)bVar12 * auVar138._8_4_ | (uint)!bVar12 * auVar131._8_4_;
        bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
        uVar164 = (uint)bVar12 * auVar138._12_4_ | (uint)!bVar12 * auVar131._12_4_;
        bVar12 = (bool)((byte)(uVar95 >> 4) & 1);
        uVar165 = (uint)bVar12 * auVar138._16_4_ | (uint)!bVar12 * auVar131._16_4_;
        bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
        uVar166 = (uint)bVar12 * auVar138._20_4_ | (uint)!bVar12 * auVar131._20_4_;
        bVar12 = (bool)((byte)(uVar95 >> 6) & 1);
        uVar167 = (uint)bVar12 * auVar138._24_4_ | (uint)!bVar12 * auVar131._24_4_;
        bVar12 = SUB81(uVar95 >> 7,0);
        uVar168 = (uint)bVar12 * auVar138._28_4_ | (uint)!bVar12 * auVar131._28_4_;
        auVar141._0_4_ = (bVar98 & 1) * uVar104 | !(bool)(bVar98 & 1) * auVar141._0_4_;
        bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar141._4_4_ = bVar12 * uVar162 | !bVar12 * auVar141._4_4_;
        bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar141._8_4_ = bVar12 * uVar163 | !bVar12 * auVar141._8_4_;
        bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar141._12_4_ = bVar12 * uVar164 | !bVar12 * auVar141._12_4_;
        bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
        auVar141._16_4_ = bVar12 * uVar165 | !bVar12 * auVar141._16_4_;
        bVar12 = (bool)((byte)(uVar103 >> 5) & 1);
        auVar141._20_4_ = bVar12 * uVar166 | !bVar12 * auVar141._20_4_;
        bVar12 = (bool)((byte)(uVar103 >> 6) & 1);
        auVar141._24_4_ = bVar12 * uVar167 | !bVar12 * auVar141._24_4_;
        bVar12 = SUB81(uVar103 >> 7,0);
        auVar141._28_4_ = bVar12 * uVar168 | !bVar12 * auVar141._28_4_;
        auVar120 = vblendmps_avx512vl(auVar249,auVar120);
        bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar95 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar95 >> 6) & 1);
        bVar18 = SUB81(uVar95 >> 7,0);
        auVar142._0_4_ =
             (uint)(bVar98 & 1) *
             ((uint)(bVar94 & 1) * auVar120._0_4_ | !(bool)(bVar94 & 1) * uVar104) |
             !(bool)(bVar98 & 1) * auVar142._0_4_;
        bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
        auVar142._4_4_ =
             (uint)bVar102 * ((uint)bVar12 * auVar120._4_4_ | !bVar12 * uVar162) |
             !bVar102 * auVar142._4_4_;
        bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
        auVar142._8_4_ =
             (uint)bVar12 * ((uint)bVar13 * auVar120._8_4_ | !bVar13 * uVar163) |
             !bVar12 * auVar142._8_4_;
        bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
        auVar142._12_4_ =
             (uint)bVar12 * ((uint)bVar14 * auVar120._12_4_ | !bVar14 * uVar164) |
             !bVar12 * auVar142._12_4_;
        bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
        auVar142._16_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar120._16_4_ | !bVar15 * uVar165) |
             !bVar12 * auVar142._16_4_;
        bVar12 = (bool)((byte)(uVar103 >> 5) & 1);
        auVar142._20_4_ =
             (uint)bVar12 * ((uint)bVar16 * auVar120._20_4_ | !bVar16 * uVar166) |
             !bVar12 * auVar142._20_4_;
        bVar12 = (bool)((byte)(uVar103 >> 6) & 1);
        auVar142._24_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar120._24_4_ | !bVar17 * uVar167) |
             !bVar12 * auVar142._24_4_;
        bVar12 = SUB81(uVar103 >> 7,0);
        auVar142._28_4_ =
             (uint)bVar12 * ((uint)bVar18 * auVar120._28_4_ | !bVar18 * uVar168) |
             !bVar12 * auVar142._28_4_;
        bVar91 = (~bVar98 | bVar94) & bVar91;
      }
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar188 = ZEXT3264(auVar131);
    if ((bVar91 & 0x7f) == 0) {
      auVar279 = ZEXT3264(local_ae0);
      auVar278 = ZEXT3264(local_b00);
    }
    else {
      fVar169 = *(float *)(ray + k * 4 + 0x200) - (float)local_9c0._0_4_;
      auVar238._4_4_ = fVar169;
      auVar238._0_4_ = fVar169;
      auVar238._8_4_ = fVar169;
      auVar238._12_4_ = fVar169;
      auVar238._16_4_ = fVar169;
      auVar238._20_4_ = fVar169;
      auVar238._24_4_ = fVar169;
      auVar238._28_4_ = fVar169;
      auVar138 = vminps_avx512vl(auVar238,auVar142);
      auVar86._4_4_ = fStack_73c;
      auVar86._0_4_ = local_740;
      auVar86._8_4_ = fStack_738;
      auVar86._12_4_ = fStack_734;
      auVar86._16_4_ = fStack_730;
      auVar86._20_4_ = fStack_72c;
      auVar86._24_4_ = fStack_728;
      auVar86._28_4_ = fStack_724;
      auVar120 = vmaxps_avx512vl(auVar86,auVar141);
      auVar130 = vmulps_avx512vl(auVar275,auVar130);
      auVar129 = vfmadd213ps_avx512vl(auVar129,auVar271,auVar130);
      auVar115 = vfmadd213ps_avx512vl(auVar115,auVar53,auVar129);
      auVar278 = ZEXT3264(local_b00);
      auVar129 = vmulps_avx512vl(local_b00,auVar275);
      auVar279 = ZEXT3264(local_ae0);
      auVar129 = vfmadd231ps_avx512vl(auVar129,local_ae0,auVar271);
      auVar129 = vfmadd231ps_avx512vl(auVar129,local_7e0,auVar53);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar129,auVar130);
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar27 = vcmpps_avx512vl(auVar130,auVar139,1);
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar115 = vxorps_avx512vl(auVar115,auVar140);
      auVar143 = vrcp14ps_avx512vl(auVar129);
      auVar144 = vxorps_avx512vl(auVar129,auVar140);
      auVar145 = vfnmadd213ps_avx512vl(auVar143,auVar129,auVar131);
      auVar145 = vfmadd132ps_avx512vl(auVar145,auVar143,auVar143);
      auVar115 = vmulps_avx512vl(auVar145,auVar115);
      uVar29 = vcmpps_avx512vl(auVar129,auVar144,1);
      bVar98 = (byte)uVar27 | (byte)uVar29;
      auVar145 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar146 = vblendmps_avx512vl(auVar115,auVar145);
      auVar147._0_4_ =
           (uint)(bVar98 & 1) * auVar146._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar143._0_4_;
      bVar12 = (bool)(bVar98 >> 1 & 1);
      auVar147._4_4_ = (uint)bVar12 * auVar146._4_4_ | (uint)!bVar12 * auVar143._4_4_;
      bVar12 = (bool)(bVar98 >> 2 & 1);
      auVar147._8_4_ = (uint)bVar12 * auVar146._8_4_ | (uint)!bVar12 * auVar143._8_4_;
      bVar12 = (bool)(bVar98 >> 3 & 1);
      auVar147._12_4_ = (uint)bVar12 * auVar146._12_4_ | (uint)!bVar12 * auVar143._12_4_;
      bVar12 = (bool)(bVar98 >> 4 & 1);
      auVar147._16_4_ = (uint)bVar12 * auVar146._16_4_ | (uint)!bVar12 * auVar143._16_4_;
      bVar12 = (bool)(bVar98 >> 5 & 1);
      auVar147._20_4_ = (uint)bVar12 * auVar146._20_4_ | (uint)!bVar12 * auVar143._20_4_;
      bVar12 = (bool)(bVar98 >> 6 & 1);
      auVar147._24_4_ = (uint)bVar12 * auVar146._24_4_ | (uint)!bVar12 * auVar143._24_4_;
      auVar147._28_4_ =
           (uint)(bVar98 >> 7) * auVar146._28_4_ | (uint)!(bool)(bVar98 >> 7) * auVar143._28_4_;
      auVar120 = vmaxps_avx(auVar120,auVar147);
      uVar29 = vcmpps_avx512vl(auVar129,auVar144,6);
      bVar98 = (byte)uVar27 | (byte)uVar29;
      auVar276 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar148._0_4_ = (uint)(bVar98 & 1) * 0x7f800000 | (uint)!(bool)(bVar98 & 1) * auVar115._0_4_;
      bVar12 = (bool)(bVar98 >> 1 & 1);
      auVar148._4_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar115._4_4_;
      bVar12 = (bool)(bVar98 >> 2 & 1);
      auVar148._8_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar115._8_4_;
      bVar12 = (bool)(bVar98 >> 3 & 1);
      auVar148._12_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar115._12_4_;
      bVar12 = (bool)(bVar98 >> 4 & 1);
      auVar148._16_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar115._16_4_;
      bVar12 = (bool)(bVar98 >> 5 & 1);
      auVar148._20_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar115._20_4_;
      bVar12 = (bool)(bVar98 >> 6 & 1);
      auVar148._24_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar115._24_4_;
      auVar148._28_4_ =
           (uint)(bVar98 >> 7) * 0x7f800000 | (uint)!(bool)(bVar98 >> 7) * auVar115._28_4_;
      auVar115 = vminps_avx(auVar138,auVar148);
      auVar108 = vxorps_avx512vl(auVar144._0_16_,auVar144._0_16_);
      auVar123 = vsubps_avx512vl(ZEXT1632(auVar108),auVar123);
      auVar124 = vsubps_avx512vl(ZEXT1632(auVar108),auVar124);
      auVar129 = ZEXT1632(auVar108);
      auVar125 = vsubps_avx512vl(auVar129,auVar125);
      auVar58._4_4_ = auVar125._4_4_ * auVar128._4_4_;
      auVar58._0_4_ = auVar125._0_4_ * auVar128._0_4_;
      auVar58._8_4_ = auVar125._8_4_ * auVar128._8_4_;
      auVar58._12_4_ = auVar125._12_4_ * auVar128._12_4_;
      auVar58._16_4_ = auVar125._16_4_ * auVar128._16_4_;
      auVar58._20_4_ = auVar125._20_4_ * auVar128._20_4_;
      auVar58._24_4_ = auVar125._24_4_ * auVar128._24_4_;
      auVar58._28_4_ = auVar125._28_4_;
      auVar124 = vfnmsub231ps_avx512vl(auVar58,auVar127,auVar124);
      auVar123 = vfnmadd231ps_avx512vl(auVar124,auVar116,auVar123);
      auVar124 = vmulps_avx512vl(local_b00,auVar128);
      auVar124 = vfnmsub231ps_avx512vl(auVar124,local_ae0,auVar127);
      auVar124 = vfnmadd231ps_avx512vl(auVar124,local_7e0,auVar116);
      vandps_avx512vl(auVar124,auVar130);
      uVar27 = vcmpps_avx512vl(auVar124,auVar139,1);
      auVar123 = vxorps_avx512vl(auVar123,auVar140);
      auVar125 = vrcp14ps_avx512vl(auVar124);
      auVar116 = vxorps_avx512vl(auVar124,auVar140);
      auVar128 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar131);
      auVar108 = vfmadd132ps_fma(auVar128,auVar125,auVar125);
      auVar272 = ZEXT1664(auVar108);
      fVar169 = auVar108._0_4_ * auVar123._0_4_;
      fVar253 = auVar108._4_4_ * auVar123._4_4_;
      auVar59._4_4_ = fVar253;
      auVar59._0_4_ = fVar169;
      fVar254 = auVar108._8_4_ * auVar123._8_4_;
      auVar59._8_4_ = fVar254;
      fVar255 = auVar108._12_4_ * auVar123._12_4_;
      auVar59._12_4_ = fVar255;
      fVar262 = auVar123._16_4_ * 0.0;
      auVar59._16_4_ = fVar262;
      fVar263 = auVar123._20_4_ * 0.0;
      auVar59._20_4_ = fVar263;
      fVar264 = auVar123._24_4_ * 0.0;
      auVar59._24_4_ = fVar264;
      auVar59._28_4_ = auVar123._28_4_;
      uVar29 = vcmpps_avx512vl(auVar124,auVar116,1);
      bVar98 = (byte)uVar27 | (byte)uVar29;
      auVar128 = vblendmps_avx512vl(auVar59,auVar145);
      auVar149._0_4_ =
           (uint)(bVar98 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar125._0_4_;
      bVar12 = (bool)(bVar98 >> 1 & 1);
      auVar149._4_4_ = (uint)bVar12 * auVar128._4_4_ | (uint)!bVar12 * auVar125._4_4_;
      bVar12 = (bool)(bVar98 >> 2 & 1);
      auVar149._8_4_ = (uint)bVar12 * auVar128._8_4_ | (uint)!bVar12 * auVar125._8_4_;
      bVar12 = (bool)(bVar98 >> 3 & 1);
      auVar149._12_4_ = (uint)bVar12 * auVar128._12_4_ | (uint)!bVar12 * auVar125._12_4_;
      bVar12 = (bool)(bVar98 >> 4 & 1);
      auVar149._16_4_ = (uint)bVar12 * auVar128._16_4_ | (uint)!bVar12 * auVar125._16_4_;
      bVar12 = (bool)(bVar98 >> 5 & 1);
      auVar149._20_4_ = (uint)bVar12 * auVar128._20_4_ | (uint)!bVar12 * auVar125._20_4_;
      bVar12 = (bool)(bVar98 >> 6 & 1);
      auVar149._24_4_ = (uint)bVar12 * auVar128._24_4_ | (uint)!bVar12 * auVar125._24_4_;
      auVar149._28_4_ =
           (uint)(bVar98 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar98 >> 7) * auVar125._28_4_;
      auVar267 = ZEXT3264(auVar149);
      _local_960 = vmaxps_avx(auVar120,auVar149);
      uVar29 = vcmpps_avx512vl(auVar124,auVar116,6);
      bVar98 = (byte)uVar27 | (byte)uVar29;
      auVar150._0_4_ = (uint)(bVar98 & 1) * 0x7f800000 | (uint)!(bool)(bVar98 & 1) * (int)fVar169;
      bVar12 = (bool)(bVar98 >> 1 & 1);
      auVar150._4_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar253;
      bVar12 = (bool)(bVar98 >> 2 & 1);
      auVar150._8_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar254;
      bVar12 = (bool)(bVar98 >> 3 & 1);
      auVar150._12_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar255;
      bVar12 = (bool)(bVar98 >> 4 & 1);
      auVar150._16_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar262;
      bVar12 = (bool)(bVar98 >> 5 & 1);
      auVar150._20_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar263;
      bVar12 = (bool)(bVar98 >> 6 & 1);
      auVar150._24_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar264;
      auVar150._28_4_ =
           (uint)(bVar98 >> 7) * 0x7f800000 | (uint)!(bool)(bVar98 >> 7) * auVar123._28_4_;
      auVar261 = ZEXT3264(auVar150);
      local_7a0 = vminps_avx(auVar115,auVar150);
      auVar260 = ZEXT3264(local_7a0);
      uVar27 = vcmpps_avx512vl(_local_960,local_7a0,2);
      bVar91 = bVar91 & 0x7f & (byte)uVar27;
      if (bVar91 != 0) {
        auVar123 = vmaxps_avx512vl(auVar129,auVar126);
        auVar120 = vminps_avx512vl(local_840,auVar131);
        auVar67 = ZEXT412(0);
        auVar267 = ZEXT1264(auVar67) << 0x20;
        auVar120 = vmaxps_avx(auVar120,ZEXT1232(auVar67) << 0x20);
        auVar124 = vminps_avx512vl(local_860,auVar131);
        auVar272 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar60._4_4_ = (auVar120._4_4_ + 1.0) * 0.125;
        auVar60._0_4_ = (auVar120._0_4_ + 0.0) * 0.125;
        auVar60._8_4_ = (auVar120._8_4_ + 2.0) * 0.125;
        auVar60._12_4_ = (auVar120._12_4_ + 3.0) * 0.125;
        auVar60._16_4_ = (auVar120._16_4_ + 4.0) * 0.125;
        auVar60._20_4_ = (auVar120._20_4_ + 5.0) * 0.125;
        auVar60._24_4_ = (auVar120._24_4_ + 6.0) * 0.125;
        auVar60._28_4_ = auVar120._28_4_ + 7.0;
        auVar108 = vfmadd213ps_fma(auVar60,local_aa0,auVar245);
        local_840 = ZEXT1632(auVar108);
        auVar120 = vmaxps_avx(auVar124,ZEXT1232(auVar67) << 0x20);
        auVar61._4_4_ = (auVar120._4_4_ + 1.0) * 0.125;
        auVar61._0_4_ = (auVar120._0_4_ + 0.0) * 0.125;
        auVar61._8_4_ = (auVar120._8_4_ + 2.0) * 0.125;
        auVar61._12_4_ = (auVar120._12_4_ + 3.0) * 0.125;
        auVar61._16_4_ = (auVar120._16_4_ + 4.0) * 0.125;
        auVar61._20_4_ = (auVar120._20_4_ + 5.0) * 0.125;
        auVar61._24_4_ = (auVar120._24_4_ + 6.0) * 0.125;
        auVar61._28_4_ = auVar120._28_4_ + 7.0;
        auVar108 = vfmadd213ps_fma(auVar61,local_aa0,auVar245);
        local_860 = ZEXT1632(auVar108);
        auVar239._0_4_ = auVar123._0_4_ * auVar123._0_4_;
        auVar239._4_4_ = auVar123._4_4_ * auVar123._4_4_;
        auVar239._8_4_ = auVar123._8_4_ * auVar123._8_4_;
        auVar239._12_4_ = auVar123._12_4_ * auVar123._12_4_;
        auVar239._16_4_ = auVar123._16_4_ * auVar123._16_4_;
        auVar239._20_4_ = auVar123._20_4_ * auVar123._20_4_;
        auVar239._24_4_ = auVar123._24_4_ * auVar123._24_4_;
        auVar239._28_4_ = 0;
        auVar120 = vsubps_avx(auVar133,auVar239);
        auVar118 = vmulps_avx512vl(auVar118,auVar120);
        auVar118 = vsubps_avx512vl(auVar137,auVar118);
        uVar27 = vcmpps_avx512vl(auVar118,ZEXT1232(auVar67) << 0x20,5);
        bVar98 = (byte)uVar27;
        if (bVar98 == 0) {
          auVar121 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar122 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar118 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar261 = ZEXT864(0) << 0x20;
          auVar151._8_4_ = 0x7f800000;
          auVar151._0_8_ = 0x7f8000007f800000;
          auVar151._12_4_ = 0x7f800000;
          auVar151._16_4_ = 0x7f800000;
          auVar151._20_4_ = 0x7f800000;
          auVar151._24_4_ = 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar152._8_4_ = 0xff800000;
          auVar152._0_8_ = 0xff800000ff800000;
          auVar152._12_4_ = 0xff800000;
          auVar152._16_4_ = 0xff800000;
          auVar152._20_4_ = 0xff800000;
          auVar152._24_4_ = 0xff800000;
          auVar152._28_4_ = 0xff800000;
        }
        else {
          auVar105 = vxorps_avx512vl(auVar127._0_16_,auVar127._0_16_);
          uVar103 = vcmpps_avx512vl(auVar118,auVar129,5);
          auVar118 = vsqrtps_avx(auVar118);
          auVar248._0_4_ = auVar119._0_4_ + auVar119._0_4_;
          auVar248._4_4_ = auVar119._4_4_ + auVar119._4_4_;
          auVar248._8_4_ = auVar119._8_4_ + auVar119._8_4_;
          auVar248._12_4_ = auVar119._12_4_ + auVar119._12_4_;
          auVar248._16_4_ = auVar119._16_4_ + auVar119._16_4_;
          auVar248._20_4_ = auVar119._20_4_ + auVar119._20_4_;
          auVar248._24_4_ = auVar119._24_4_ + auVar119._24_4_;
          auVar248._28_4_ = auVar119._28_4_ + auVar119._28_4_;
          auVar123 = vrcp14ps_avx512vl(auVar248);
          auVar124 = vfnmadd213ps_avx512vl(auVar248,auVar123,auVar131);
          auVar108 = vfmadd132ps_fma(auVar124,auVar123,auVar123);
          auVar35._8_4_ = 0x80000000;
          auVar35._0_8_ = 0x8000000080000000;
          auVar35._12_4_ = 0x80000000;
          auVar35._16_4_ = 0x80000000;
          auVar35._20_4_ = 0x80000000;
          auVar35._24_4_ = 0x80000000;
          auVar35._28_4_ = 0x80000000;
          auVar123 = vxorps_avx512vl(auVar132,auVar35);
          auVar123 = vsubps_avx(auVar123,auVar118);
          auVar62._4_4_ = auVar123._4_4_ * auVar108._4_4_;
          auVar62._0_4_ = auVar123._0_4_ * auVar108._0_4_;
          auVar62._8_4_ = auVar123._8_4_ * auVar108._8_4_;
          auVar62._12_4_ = auVar123._12_4_ * auVar108._12_4_;
          auVar62._16_4_ = auVar123._16_4_ * 0.0;
          auVar62._20_4_ = auVar123._20_4_ * 0.0;
          auVar62._24_4_ = auVar123._24_4_ * 0.0;
          auVar62._28_4_ = 0x3e000000;
          auVar118 = vsubps_avx512vl(auVar118,auVar132);
          auVar63._4_4_ = auVar118._4_4_ * auVar108._4_4_;
          auVar63._0_4_ = auVar118._0_4_ * auVar108._0_4_;
          auVar63._8_4_ = auVar118._8_4_ * auVar108._8_4_;
          auVar63._12_4_ = auVar118._12_4_ * auVar108._12_4_;
          auVar63._16_4_ = auVar118._16_4_ * 0.0;
          auVar63._20_4_ = auVar118._20_4_ * 0.0;
          auVar63._24_4_ = auVar118._24_4_ * 0.0;
          auVar63._28_4_ = 0x7f800000;
          auVar276 = ZEXT3264(auVar63);
          auVar118 = vfmadd213ps_avx512vl(auVar134,auVar62,auVar135);
          auVar64._4_4_ = auVar114._4_4_ * auVar118._4_4_;
          auVar64._0_4_ = auVar114._0_4_ * auVar118._0_4_;
          auVar64._8_4_ = auVar114._8_4_ * auVar118._8_4_;
          auVar64._12_4_ = auVar114._12_4_ * auVar118._12_4_;
          auVar64._16_4_ = auVar114._16_4_ * auVar118._16_4_;
          auVar64._20_4_ = auVar114._20_4_ * auVar118._20_4_;
          auVar64._24_4_ = auVar114._24_4_ * auVar118._24_4_;
          auVar64._28_4_ = auVar123._28_4_;
          auVar118 = vmulps_avx512vl(local_7e0,auVar62);
          auVar123 = vmulps_avx512vl(local_ae0,auVar62);
          auVar124 = vmulps_avx512vl(local_b00,auVar62);
          auVar125 = vfmadd213ps_avx512vl(auVar121,auVar64,local_b60);
          auVar118 = vsubps_avx512vl(auVar118,auVar125);
          auVar125 = vfmadd213ps_avx512vl(auVar122,auVar64,auVar225);
          auVar123 = vsubps_avx512vl(auVar123,auVar125);
          auVar108 = vfmadd213ps_fma(auVar64,local_920,local_ac0);
          auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar108));
          auVar261 = ZEXT3264(auVar124);
          auVar124 = vfmadd213ps_avx512vl(auVar134,auVar63,auVar135);
          auVar124 = vmulps_avx512vl(auVar114,auVar124);
          auVar125 = vmulps_avx512vl(local_7e0,auVar63);
          auVar126 = vmulps_avx512vl(local_ae0,auVar63);
          auVar116 = vmulps_avx512vl(local_b00,auVar63);
          auVar108 = vfmadd213ps_fma(auVar121,auVar124,local_b60);
          auVar121 = vsubps_avx(auVar125,ZEXT1632(auVar108));
          auVar267 = ZEXT3264(auVar121);
          auVar108 = vfmadd213ps_fma(auVar122,auVar124,auVar225);
          auVar121 = vsubps_avx512vl(auVar126,ZEXT1632(auVar108));
          auVar108 = vfmadd213ps_fma(local_920,auVar124,local_ac0);
          auVar122 = vsubps_avx512vl(auVar116,ZEXT1632(auVar108));
          auVar179._8_4_ = 0x7f800000;
          auVar179._0_8_ = 0x7f8000007f800000;
          auVar179._12_4_ = 0x7f800000;
          auVar179._16_4_ = 0x7f800000;
          auVar179._20_4_ = 0x7f800000;
          auVar179._24_4_ = 0x7f800000;
          auVar179._28_4_ = 0x7f800000;
          auVar124 = vblendmps_avx512vl(auVar179,auVar62);
          bVar12 = (bool)((byte)uVar103 & 1);
          auVar151._0_4_ = (uint)bVar12 * auVar124._0_4_ | (uint)!bVar12 * auVar266._0_4_;
          bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar12 * auVar124._4_4_ | (uint)!bVar12 * auVar266._4_4_;
          bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar12 * auVar124._8_4_ | (uint)!bVar12 * auVar266._8_4_;
          bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar12 * auVar124._12_4_ | (uint)!bVar12 * auVar266._12_4_;
          iVar1 = (uint)((byte)(uVar103 >> 4) & 1) * auVar124._16_4_;
          auVar151._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar103 >> 5) & 1) * auVar124._20_4_;
          auVar151._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar103 >> 6) & 1) * auVar124._24_4_;
          auVar151._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar103 >> 7) * auVar124._28_4_;
          auVar151._28_4_ = iVar4;
          auVar180._8_4_ = 0xff800000;
          auVar180._0_8_ = 0xff800000ff800000;
          auVar180._12_4_ = 0xff800000;
          auVar180._16_4_ = 0xff800000;
          auVar180._20_4_ = 0xff800000;
          auVar180._24_4_ = 0xff800000;
          auVar180._28_4_ = 0xff800000;
          auVar124 = vblendmps_avx512vl(auVar180,auVar63);
          bVar12 = (bool)((byte)uVar103 & 1);
          auVar152._0_4_ = (uint)bVar12 * auVar124._0_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar152._4_4_ = (uint)bVar12 * auVar124._4_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar152._8_4_ = (uint)bVar12 * auVar124._8_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar152._12_4_ = (uint)bVar12 * auVar124._12_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
          auVar152._16_4_ = (uint)bVar12 * auVar124._16_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar103 >> 5) & 1);
          auVar152._20_4_ = (uint)bVar12 * auVar124._20_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar103 >> 6) & 1);
          auVar152._24_4_ = (uint)bVar12 * auVar124._24_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = SUB81(uVar103 >> 7,0);
          auVar152._28_4_ = (uint)bVar12 * auVar124._28_4_ | (uint)!bVar12 * -0x800000;
          auVar257._8_4_ = 0x7fffffff;
          auVar257._0_8_ = 0x7fffffff7fffffff;
          auVar257._12_4_ = 0x7fffffff;
          auVar257._16_4_ = 0x7fffffff;
          auVar257._20_4_ = 0x7fffffff;
          auVar257._24_4_ = 0x7fffffff;
          auVar257._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar136,auVar257);
          auVar272 = ZEXT3264(local_800);
          auVar124 = vmaxps_avx(local_800,auVar152);
          auVar36._8_4_ = 0x36000000;
          auVar36._0_8_ = 0x3600000036000000;
          auVar36._12_4_ = 0x36000000;
          auVar36._16_4_ = 0x36000000;
          auVar36._20_4_ = 0x36000000;
          auVar36._24_4_ = 0x36000000;
          auVar36._28_4_ = 0x36000000;
          auVar124 = vmulps_avx512vl(auVar124,auVar36);
          auVar119 = vandps_avx(auVar119,auVar257);
          uVar95 = vcmpps_avx512vl(auVar119,auVar124,1);
          uVar103 = uVar103 & uVar95;
          bVar94 = (byte)uVar103;
          if (bVar94 != 0) {
            uVar95 = vcmpps_avx512vl(auVar120,ZEXT1632(auVar105),2);
            auVar258._8_4_ = 0xff800000;
            auVar258._0_8_ = 0xff800000ff800000;
            auVar258._12_4_ = 0xff800000;
            auVar258._16_4_ = 0xff800000;
            auVar258._20_4_ = 0xff800000;
            auVar258._24_4_ = 0xff800000;
            auVar258._28_4_ = 0xff800000;
            auVar269._8_4_ = 0x7f800000;
            auVar269._0_8_ = 0x7f8000007f800000;
            auVar269._12_4_ = 0x7f800000;
            auVar269._16_4_ = 0x7f800000;
            auVar269._20_4_ = 0x7f800000;
            auVar269._24_4_ = 0x7f800000;
            auVar269._28_4_ = 0x7f800000;
            auVar119 = vblendmps_avx512vl(auVar269,auVar258);
            bVar97 = (byte)uVar95;
            uVar104 = (uint)(bVar97 & 1) * auVar119._0_4_ |
                      (uint)!(bool)(bVar97 & 1) * auVar124._0_4_;
            bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
            uVar162 = (uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * auVar124._4_4_;
            bVar12 = (bool)((byte)(uVar95 >> 2) & 1);
            uVar163 = (uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * auVar124._8_4_;
            bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
            uVar164 = (uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * auVar124._12_4_;
            bVar12 = (bool)((byte)(uVar95 >> 4) & 1);
            uVar165 = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * auVar124._16_4_;
            bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
            uVar166 = (uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * auVar124._20_4_;
            bVar12 = (bool)((byte)(uVar95 >> 6) & 1);
            uVar167 = (uint)bVar12 * auVar119._24_4_ | (uint)!bVar12 * auVar124._24_4_;
            bVar12 = SUB81(uVar95 >> 7,0);
            uVar168 = (uint)bVar12 * auVar119._28_4_ | (uint)!bVar12 * auVar124._28_4_;
            auVar151._0_4_ = (bVar94 & 1) * uVar104 | !(bool)(bVar94 & 1) * auVar151._0_4_;
            bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar151._4_4_ = bVar12 * uVar162 | !bVar12 * auVar151._4_4_;
            bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar151._8_4_ = bVar12 * uVar163 | !bVar12 * auVar151._8_4_;
            bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar151._12_4_ = bVar12 * uVar164 | !bVar12 * auVar151._12_4_;
            bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
            auVar151._16_4_ = bVar12 * uVar165 | (uint)!bVar12 * iVar1;
            bVar12 = (bool)((byte)(uVar103 >> 5) & 1);
            auVar151._20_4_ = bVar12 * uVar166 | (uint)!bVar12 * iVar2;
            bVar12 = (bool)((byte)(uVar103 >> 6) & 1);
            auVar151._24_4_ = bVar12 * uVar167 | (uint)!bVar12 * iVar3;
            bVar12 = SUB81(uVar103 >> 7,0);
            auVar151._28_4_ = bVar12 * uVar168 | (uint)!bVar12 * iVar4;
            auVar119 = vblendmps_avx512vl(auVar258,auVar269);
            bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar95 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar95 >> 6) & 1);
            bVar18 = SUB81(uVar95 >> 7,0);
            auVar152._0_4_ =
                 (uint)(bVar94 & 1) *
                 ((uint)(bVar97 & 1) * auVar119._0_4_ | !(bool)(bVar97 & 1) * uVar104) |
                 !(bool)(bVar94 & 1) * auVar152._0_4_;
            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
            auVar152._4_4_ =
                 (uint)bVar102 * ((uint)bVar12 * auVar119._4_4_ | !bVar12 * uVar162) |
                 !bVar102 * auVar152._4_4_;
            bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
            auVar152._8_4_ =
                 (uint)bVar12 * ((uint)bVar13 * auVar119._8_4_ | !bVar13 * uVar163) |
                 !bVar12 * auVar152._8_4_;
            bVar12 = (bool)((byte)(uVar103 >> 3) & 1);
            auVar152._12_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar119._12_4_ | !bVar14 * uVar164) |
                 !bVar12 * auVar152._12_4_;
            bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
            auVar152._16_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar119._16_4_ | !bVar15 * uVar165) |
                 !bVar12 * auVar152._16_4_;
            bVar12 = (bool)((byte)(uVar103 >> 5) & 1);
            auVar152._20_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar119._20_4_ | !bVar16 * uVar166) |
                 !bVar12 * auVar152._20_4_;
            bVar12 = (bool)((byte)(uVar103 >> 6) & 1);
            auVar152._24_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar119._24_4_ | !bVar17 * uVar167) |
                 !bVar12 * auVar152._24_4_;
            bVar12 = SUB81(uVar103 >> 7,0);
            auVar152._28_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar119._28_4_ | !bVar18 * uVar168) |
                 !bVar12 * auVar152._28_4_;
            bVar98 = (~bVar94 | bVar97) & bVar98;
          }
        }
        auVar268._8_4_ = 0x7fffffff;
        auVar268._0_8_ = 0x7fffffff7fffffff;
        auVar268._12_4_ = 0x7fffffff;
        auVar119 = vmulps_avx512vl(local_b00,auVar122);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_ae0,auVar121);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_7e0,auVar267._0_32_);
        _local_500 = _local_960;
        local_4e0 = vminps_avx(local_7a0,auVar151);
        auVar252._8_4_ = 0x7fffffff;
        auVar252._0_8_ = 0x7fffffff7fffffff;
        auVar252._12_4_ = 0x7fffffff;
        auVar252._16_4_ = 0x7fffffff;
        auVar252._20_4_ = 0x7fffffff;
        auVar252._24_4_ = 0x7fffffff;
        auVar252._28_4_ = 0x7fffffff;
        auVar119 = vandps_avx(auVar119,auVar252);
        _local_8a0 = vmaxps_avx(_local_960,auVar152);
        auVar251 = ZEXT3264(_local_8a0);
        _local_7c0 = _local_8a0;
        auVar181._8_4_ = 0x3e99999a;
        auVar181._0_8_ = 0x3e99999a3e99999a;
        auVar181._12_4_ = 0x3e99999a;
        auVar181._16_4_ = 0x3e99999a;
        auVar181._20_4_ = 0x3e99999a;
        auVar181._24_4_ = 0x3e99999a;
        auVar181._28_4_ = 0x3e99999a;
        uVar27 = vcmpps_avx512vl(auVar119,auVar181,1);
        uVar29 = vcmpps_avx512vl(_local_960,local_4e0,2);
        bVar94 = (byte)uVar29 & bVar91;
        uVar28 = vcmpps_avx512vl(_local_8a0,local_7a0,2);
        if ((bVar91 & ((byte)uVar28 | (byte)uVar29)) == 0) {
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar188 = ZEXT3264(auVar119);
        }
        else {
          auVar119 = vmulps_avx512vl(local_b00,auVar261._0_32_);
          auVar119 = vfmadd213ps_avx512vl(auVar123,local_ae0,auVar119);
          auVar119 = vfmadd213ps_avx512vl(auVar118,local_7e0,auVar119);
          auVar119 = vandps_avx(auVar119,auVar252);
          uVar29 = vcmpps_avx512vl(auVar119,auVar181,1);
          bVar97 = (byte)uVar29 | ~bVar98;
          auVar182._8_4_ = 2;
          auVar182._0_8_ = 0x200000002;
          auVar182._12_4_ = 2;
          auVar182._16_4_ = 2;
          auVar182._20_4_ = 2;
          auVar182._24_4_ = 2;
          auVar182._28_4_ = 2;
          auVar37._8_4_ = 3;
          auVar37._0_8_ = 0x300000003;
          auVar37._12_4_ = 3;
          auVar37._16_4_ = 3;
          auVar37._20_4_ = 3;
          auVar37._24_4_ = 3;
          auVar37._28_4_ = 3;
          auVar119 = vpblendmd_avx512vl(auVar182,auVar37);
          local_780._0_4_ = (uint)(bVar97 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar97 & 1) * 2;
          bVar12 = (bool)(bVar97 >> 1 & 1);
          local_780._4_4_ = (uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar97 >> 2 & 1);
          local_780._8_4_ = (uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar97 >> 3 & 1);
          local_780._12_4_ = (uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar97 >> 4 & 1);
          local_780._16_4_ = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar97 >> 5 & 1);
          local_780._20_4_ = (uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar97 >> 6 & 1);
          local_780._24_4_ = (uint)bVar12 * auVar119._24_4_ | (uint)!bVar12 * 2;
          local_780._28_4_ = (uint)(bVar97 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar97 >> 7) * 2;
          auVar158._0_32_ = vpbroadcastd_avx512vl();
          auVar158._32_32_ = auVar117;
          local_820 = auVar158._0_32_;
          uVar29 = vpcmpd_avx512vl(auVar158._0_32_,local_780,5);
          bVar97 = (byte)uVar29 & bVar94;
          if (bVar97 != 0) {
            auVar266 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar108 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar105 = vminps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar6 = vminps_avx(auVar266,auVar105);
            auVar266 = vmaxps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar105 = vmaxps_avx(auVar108,auVar266);
            auVar108 = vandps_avx(auVar268,auVar6);
            auVar266 = vandps_avx(auVar268,auVar105);
            auVar108 = vmaxps_avx(auVar108,auVar266);
            auVar266 = vmovshdup_avx(auVar108);
            auVar266 = vmaxss_avx(auVar266,auVar108);
            auVar108 = vshufpd_avx(auVar108,auVar108,1);
            auVar108 = vmaxss_avx(auVar108,auVar266);
            fVar169 = auVar108._0_4_ * 1.9073486e-06;
            local_9d0 = vshufps_avx(auVar105,auVar105,0xff);
            local_880 = (float)local_960._0_4_ + (float)local_940._0_4_;
            fStack_87c = (float)local_960._4_4_ + (float)local_940._4_4_;
            fStack_878 = fStack_958 + fStack_938;
            fStack_874 = fStack_954 + fStack_934;
            fStack_870 = fStack_950 + fStack_930;
            fStack_86c = fStack_94c + fStack_92c;
            fStack_868 = fStack_948 + fStack_928;
            fStack_864 = fStack_944 + fStack_924;
            do {
              auVar183._8_4_ = 0x7f800000;
              auVar183._0_8_ = 0x7f8000007f800000;
              auVar183._12_4_ = 0x7f800000;
              auVar183._16_4_ = 0x7f800000;
              auVar183._20_4_ = 0x7f800000;
              auVar183._24_4_ = 0x7f800000;
              auVar183._28_4_ = 0x7f800000;
              auVar119 = vblendmps_avx512vl(auVar183,_local_960);
              auVar153._0_4_ =
                   (uint)(bVar97 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar97 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 1 & 1);
              auVar153._4_4_ = (uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 2 & 1);
              auVar153._8_4_ = (uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 3 & 1);
              auVar153._12_4_ = (uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 4 & 1);
              auVar153._16_4_ = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar97 >> 5 & 1);
              auVar153._20_4_ = (uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar153._24_4_ =
                   (uint)(bVar97 >> 6) * auVar119._24_4_ | (uint)!(bool)(bVar97 >> 6) * 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar158._0_32_ = auVar153;
              auVar119 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar119 = vminps_avx(auVar153,auVar119);
              auVar117 = vshufpd_avx(auVar119,auVar119,5);
              auVar119 = vminps_avx(auVar119,auVar117);
              auVar117 = vpermpd_avx2(auVar119,0x4e);
              auVar119 = vminps_avx(auVar119,auVar117);
              uVar29 = vcmpps_avx512vl(auVar153,auVar119,0);
              bVar92 = (byte)uVar29 & bVar97;
              bVar93 = bVar97;
              if (bVar92 != 0) {
                bVar93 = bVar92;
              }
              iVar2 = 0;
              for (uVar104 = (uint)bVar93; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000)
              {
                iVar2 = iVar2 + 1;
              }
              uVar104 = *(uint *)(local_840 + (uint)(iVar2 << 2));
              uVar162 = *(uint *)(local_500 + (uint)(iVar2 << 2));
              fVar253 = auVar26._0_4_;
              if ((float)local_a80._0_4_ < 0.0) {
                fVar253 = sqrtf((float)local_a80._0_4_);
              }
              auVar267 = ZEXT464(uVar104);
              auVar260 = ZEXT464(uVar162);
              lVar101 = 4;
              do {
                auVar119 = auVar158._32_32_;
                fVar254 = auVar260._0_4_;
                auVar171._4_4_ = fVar254;
                auVar171._0_4_ = fVar254;
                auVar171._8_4_ = fVar254;
                auVar171._12_4_ = fVar254;
                auVar108 = vfmadd132ps_fma(auVar171,ZEXT816(0) << 0x40,local_a70);
                fVar265 = auVar267._0_4_;
                fVar250 = 1.0 - fVar265;
                fVar263 = fVar250 * fVar250 * fVar250;
                fVar255 = fVar265 * fVar265;
                fVar256 = fVar265 * fVar255;
                auVar266 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar263),
                                           ZEXT416((uint)fVar256));
                fVar262 = fVar265 * fVar250;
                auVar106 = ZEXT416((uint)fVar250);
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar265 * fVar262 * 6.0)),
                                         ZEXT416((uint)(fVar262 * fVar250)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar256),
                                           ZEXT416((uint)fVar263));
                auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar262 * fVar250 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar265 * fVar262)));
                fVar263 = fVar263 * 0.16666667;
                fVar264 = (auVar266._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar231 = (auVar105._0_4_ + auVar109._0_4_) * 0.16666667;
                fVar256 = fVar256 * 0.16666667;
                auVar215._0_4_ = fVar256 * (float)local_a60._0_4_;
                auVar215._4_4_ = fVar256 * (float)local_a60._4_4_;
                auVar215._8_4_ = fVar256 * fStack_a58;
                auVar215._12_4_ = fVar256 * fStack_a54;
                auVar241._4_4_ = fVar231;
                auVar241._0_4_ = fVar231;
                auVar241._8_4_ = fVar231;
                auVar241._12_4_ = fVar231;
                auVar266 = vfmadd132ps_fma(auVar241,auVar215,local_a20._0_16_);
                auVar216._4_4_ = fVar264;
                auVar216._0_4_ = fVar264;
                auVar216._8_4_ = fVar264;
                auVar216._12_4_ = fVar264;
                auVar266 = vfmadd132ps_fma(auVar216,auVar266,local_a40._0_16_);
                auVar195._4_4_ = fVar263;
                auVar195._0_4_ = fVar263;
                auVar195._8_4_ = fVar263;
                auVar195._12_4_ = fVar263;
                auVar266 = vfmadd132ps_fma(auVar195,auVar266,local_a00._0_16_);
                local_920._0_16_ = auVar266;
                auVar108 = vsubps_avx(auVar108,auVar266);
                local_aa0._0_16_ = auVar108;
                auVar108 = vdpps_avx(auVar108,auVar108,0x7f);
                auVar266 = auVar267._0_16_;
                local_ac0._0_16_ = auVar108;
                if (auVar108._0_4_ < 0.0) {
                  local_b60._0_4_ = fVar255;
                  auVar272._0_4_ = sqrtf(auVar108._0_4_);
                  auVar272._4_60_ = extraout_var;
                  auVar108 = auVar272._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  local_b60._0_4_ = fVar255;
                }
                auVar6 = vfnmsub213ss_fma(auVar266,auVar266,ZEXT416((uint)(fVar262 * 4.0)));
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar262 * 4.0)),auVar106,auVar106);
                fVar255 = fVar250 * -fVar250 * 0.5;
                fVar262 = auVar6._0_4_ * 0.5;
                fVar263 = auVar105._0_4_ * 0.5;
                local_b60._0_4_ = (float)local_b60._0_4_ * 0.5;
                auVar233._0_4_ = (float)local_b60._0_4_ * (float)local_a60._0_4_;
                auVar233._4_4_ = (float)local_b60._0_4_ * (float)local_a60._4_4_;
                auVar233._8_4_ = (float)local_b60._0_4_ * fStack_a58;
                auVar233._12_4_ = (float)local_b60._0_4_ * fStack_a54;
                auVar196._4_4_ = fVar263;
                auVar196._0_4_ = fVar263;
                auVar196._8_4_ = fVar263;
                auVar196._12_4_ = fVar263;
                auVar105 = vfmadd132ps_fma(auVar196,auVar233,local_a20._0_16_);
                auVar217._4_4_ = fVar262;
                auVar217._0_4_ = fVar262;
                auVar217._8_4_ = fVar262;
                auVar217._12_4_ = fVar262;
                auVar105 = vfmadd132ps_fma(auVar217,auVar105,local_a40._0_16_);
                auVar273._4_4_ = fVar255;
                auVar273._0_4_ = fVar255;
                auVar273._8_4_ = fVar255;
                auVar273._12_4_ = fVar255;
                local_b60._0_16_ = vfmadd132ps_fma(auVar273,auVar105,local_a00._0_16_);
                local_980 = vdpps_avx(local_b60._0_16_,local_b60._0_16_,0x7f);
                auVar68._12_4_ = 0;
                auVar68._0_12_ = ZEXT812(0);
                fVar255 = local_980._0_4_;
                auVar105 = vrsqrt14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar255));
                fVar262 = auVar105._0_4_;
                local_990 = vrcp14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar255));
                auVar105 = vfnmadd213ss_fma(local_990,local_980,ZEXT416(0x40000000));
                uVar104 = auVar108._0_4_;
                local_970 = fVar250;
                fStack_96c = fVar250;
                fStack_968 = fVar250;
                fStack_964 = fVar250;
                if (fVar255 < -fVar255) {
                  auVar276._0_4_ = sqrtf(fVar255);
                  auVar276._4_60_ = extraout_var_00;
                  auVar108 = ZEXT416(uVar104);
                  auVar109 = auVar276._0_16_;
                  auVar6 = local_b60._0_16_;
                }
                else {
                  auVar109 = vsqrtss_avx512f(local_980,local_980);
                  auVar6 = local_b60._0_16_;
                }
                fVar255 = fVar262 * 1.5 + fVar255 * -0.5 * fVar262 * fVar262 * fVar262;
                auVar172._0_4_ = auVar6._0_4_ * fVar255;
                auVar172._4_4_ = auVar6._4_4_ * fVar255;
                auVar172._8_4_ = auVar6._8_4_ * fVar255;
                auVar172._12_4_ = auVar6._12_4_ * fVar255;
                auVar277 = vdpps_avx(local_aa0._0_16_,auVar172,0x7f);
                fVar264 = auVar108._0_4_;
                fVar262 = auVar277._0_4_;
                auVar173._0_4_ = fVar262 * fVar262;
                auVar173._4_4_ = auVar277._4_4_ * auVar277._4_4_;
                auVar173._8_4_ = auVar277._8_4_ * auVar277._8_4_;
                auVar173._12_4_ = auVar277._12_4_ * auVar277._12_4_;
                auVar110 = vsubps_avx512vl(local_ac0._0_16_,auVar173);
                fVar263 = auVar110._0_4_;
                auVar197._4_12_ = ZEXT812(0) << 0x20;
                auVar197._0_4_ = fVar263;
                auVar111 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
                auVar112 = vmulss_avx512f(auVar111,ZEXT416(0x3fc00000));
                auVar113 = vmulss_avx512f(auVar110,ZEXT416(0xbf000000));
                if (fVar263 < 0.0) {
                  local_9b0 = fVar255;
                  fStack_9ac = fVar255;
                  fStack_9a8 = fVar255;
                  fStack_9a4 = fVar255;
                  local_9a0 = auVar111;
                  fVar263 = sqrtf(fVar263);
                  auVar113 = ZEXT416(auVar113._0_4_);
                  auVar112 = ZEXT416(auVar112._0_4_);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar108 = ZEXT416(uVar104);
                  auVar6 = local_b60._0_16_;
                  auVar111 = local_9a0;
                  fVar255 = local_9b0;
                  fVar231 = fStack_9ac;
                  fVar256 = fStack_9a8;
                  fVar250 = fStack_9a4;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar110,auVar110);
                  fVar263 = auVar110._0_4_;
                  fVar231 = fVar255;
                  fVar256 = fVar255;
                  fVar250 = fVar255;
                }
                auVar276 = ZEXT1664(auVar6);
                auVar261 = ZEXT1664(local_aa0._0_16_);
                auVar268._8_4_ = 0x7fffffff;
                auVar268._0_8_ = 0x7fffffff7fffffff;
                auVar268._12_4_ = 0x7fffffff;
                auVar279 = ZEXT3264(local_ae0);
                auVar251._32_32_ = auVar119;
                auVar251._0_32_ = local_b00;
                auVar278 = ZEXT3264(local_b00);
                auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar106,auVar266);
                auVar266 = vfmadd231ss_fma(auVar106,auVar266,SUB6416(ZEXT464(0xc0000000),0));
                auVar218._0_4_ = fVar265 * (float)local_a60._0_4_;
                auVar218._4_4_ = fVar265 * (float)local_a60._4_4_;
                auVar218._8_4_ = fVar265 * fStack_a58;
                auVar218._12_4_ = fVar265 * fStack_a54;
                auVar234._0_4_ = auVar266._0_4_;
                auVar234._4_4_ = auVar234._0_4_;
                auVar234._8_4_ = auVar234._0_4_;
                auVar234._12_4_ = auVar234._0_4_;
                auVar266 = vfmadd132ps_fma(auVar234,auVar218,local_a20._0_16_);
                auVar198._0_4_ = auVar110._0_4_;
                auVar198._4_4_ = auVar198._0_4_;
                auVar198._8_4_ = auVar198._0_4_;
                auVar198._12_4_ = auVar198._0_4_;
                auVar266 = vfmadd132ps_fma(auVar198,auVar266,local_a40._0_16_);
                auVar82._4_4_ = fStack_96c;
                auVar82._0_4_ = local_970;
                auVar82._8_4_ = fStack_968;
                auVar82._12_4_ = fStack_964;
                auVar266 = vfmadd132ps_fma(auVar82,auVar266,local_a00._0_16_);
                auVar199._0_4_ = auVar266._0_4_ * (float)local_980._0_4_;
                auVar199._4_4_ = auVar266._4_4_ * (float)local_980._0_4_;
                auVar199._8_4_ = auVar266._8_4_ * (float)local_980._0_4_;
                auVar199._12_4_ = auVar266._12_4_ * (float)local_980._0_4_;
                auVar266 = vdpps_avx(auVar6,auVar266,0x7f);
                fVar214 = auVar266._0_4_;
                auVar219._0_4_ = auVar6._0_4_ * fVar214;
                auVar219._4_4_ = auVar6._4_4_ * fVar214;
                auVar219._8_4_ = auVar6._8_4_ * fVar214;
                auVar219._12_4_ = auVar6._12_4_ * fVar214;
                auVar266 = vsubps_avx(auVar199,auVar219);
                fVar214 = auVar105._0_4_ * (float)local_990._0_4_;
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar158._16_48_ = auVar251._16_48_;
                auVar110 = vxorps_avx512vl(auVar6,auVar30);
                auVar242._0_4_ = fVar255 * auVar266._0_4_ * fVar214;
                auVar242._4_4_ = fVar231 * auVar266._4_4_ * fVar214;
                auVar242._8_4_ = fVar256 * auVar266._8_4_ * fVar214;
                auVar242._12_4_ = fVar250 * auVar266._12_4_ * fVar214;
                auVar272 = ZEXT1664(auVar172);
                auVar266 = vdpps_avx(auVar110,auVar172,0x7f);
                auVar106 = vmaxss_avx(ZEXT416((uint)fVar169),
                                      ZEXT416((uint)(fVar254 * fVar253 * 1.9073486e-06)));
                auVar109 = vdivss_avx512f(ZEXT416((uint)fVar169),auVar109);
                auVar105 = vdpps_avx(local_aa0._0_16_,auVar242,0x7f);
                auVar108 = vfmadd213ss_fma(auVar108,ZEXT416((uint)fVar169),auVar106);
                auVar109 = vfmadd213ss_fma(ZEXT416((uint)(fVar264 + 1.0)),auVar109,auVar108);
                auVar108 = vdpps_avx(local_a70,auVar172,0x7f);
                fVar255 = auVar266._0_4_ + auVar105._0_4_;
                auVar266 = vdpps_avx(local_aa0._0_16_,auVar110,0x7f);
                auVar110 = vmulss_avx512f(auVar113,auVar111);
                auVar111 = vmulss_avx512f(auVar111,auVar111);
                auVar105 = vdpps_avx(local_aa0._0_16_,local_a70,0x7f);
                auVar158._0_16_ =
                     vaddss_avx512f(auVar112,ZEXT416((uint)(auVar110._0_4_ * auVar111._0_4_)));
                auVar111 = vfnmadd231ss_fma(auVar266,auVar277,ZEXT416((uint)fVar255));
                auVar110 = vfnmadd231ss_fma(auVar105,auVar277,auVar108);
                auVar266 = vpermilps_avx(local_920._0_16_,0xff);
                fVar263 = fVar263 - auVar266._0_4_;
                auVar266 = vshufps_avx(auVar6,auVar6,0xff);
                auVar105 = vfmsub213ss_fma(auVar111,auVar158._0_16_,auVar266);
                fVar264 = auVar110._0_4_ * auVar158._0_4_;
                auVar111 = vfmsub231ss_fma(ZEXT416((uint)(auVar108._0_4_ * auVar105._0_4_)),
                                           ZEXT416((uint)fVar255),ZEXT416((uint)fVar264));
                fVar256 = auVar111._0_4_;
                fVar231 = fVar262 * (auVar105._0_4_ / fVar256);
                auVar251 = ZEXT464((uint)fVar231);
                fVar265 = fVar265 - (fVar262 * (fVar264 / fVar256) -
                                    fVar263 * (auVar108._0_4_ / fVar256));
                auVar267 = ZEXT464((uint)fVar265);
                fVar254 = fVar254 - (fVar263 * (fVar255 / fVar256) - fVar231);
                auVar260 = ZEXT464((uint)fVar254);
                auVar108 = vandps_avx(auVar277,auVar268);
                if (auVar109._0_4_ <= auVar108._0_4_) {
LAB_01d496fb:
                  bVar12 = false;
                }
                else {
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(auVar109._0_4_ + auVar106._0_4_)),
                                             local_9d0,ZEXT416(0x36000000));
                  auVar108 = vandps_avx(auVar268,ZEXT416((uint)fVar263));
                  if (auVar105._0_4_ <= auVar108._0_4_) goto LAB_01d496fb;
                  fVar254 = fVar254 + (float)local_9c0._0_4_;
                  auVar260 = ZEXT464((uint)fVar254);
                  bVar12 = true;
                  if ((((fVar232 <= fVar254) &&
                       (fVar255 = *(float *)(ray + k * 4 + 0x200), fVar254 <= fVar255)) &&
                      (0.0 <= fVar265)) && (fVar265 <= 1.0)) {
                    auVar157._16_48_ = auVar158._16_48_;
                    auVar157._0_16_ = ZEXT816(0) << 0x20;
                    auVar156._4_60_ = auVar157._4_60_;
                    auVar156._0_4_ = local_ac0._0_4_;
                    auVar108 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar156._0_16_);
                    fVar262 = auVar108._0_4_;
                    auVar158._0_16_ = vmulss_avx512f(local_ac0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar100].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar262 = fVar262 * 1.5 + auVar158._0_4_ * fVar262 * fVar262 * fVar262;
                      auVar200._0_4_ = local_aa0._0_4_ * fVar262;
                      auVar200._4_4_ = local_aa0._4_4_ * fVar262;
                      auVar200._8_4_ = local_aa0._8_4_ * fVar262;
                      auVar200._12_4_ = local_aa0._12_4_ * fVar262;
                      auVar109 = vfmadd213ps_fma(auVar266,auVar200,auVar6);
                      auVar108 = vshufps_avx(auVar200,auVar200,0xc9);
                      auVar266 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar201._0_4_ = auVar200._0_4_ * auVar266._0_4_;
                      auVar201._4_4_ = auVar200._4_4_ * auVar266._4_4_;
                      auVar201._8_4_ = auVar200._8_4_ * auVar266._8_4_;
                      auVar201._12_4_ = auVar200._12_4_ * auVar266._12_4_;
                      auVar105 = vfmsub231ps_fma(auVar201,auVar6,auVar108);
                      auVar108 = vshufps_avx(auVar105,auVar105,0xc9);
                      auVar266 = vshufps_avx(auVar109,auVar109,0xc9);
                      auVar105 = vshufps_avx(auVar105,auVar105,0xd2);
                      auVar174._0_4_ = auVar109._0_4_ * auVar105._0_4_;
                      auVar174._4_4_ = auVar109._4_4_ * auVar105._4_4_;
                      auVar174._8_4_ = auVar109._8_4_ * auVar105._8_4_;
                      auVar174._12_4_ = auVar109._12_4_ * auVar105._12_4_;
                      auVar108 = vfmsub231ps_fma(auVar174,auVar108,auVar266);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar254;
                        uVar8 = vextractps_avx(auVar108,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar8;
                        uVar8 = vextractps_avx(auVar108,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar8;
                        *(int *)(ray + k * 4 + 0x380) = auVar108._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar265;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x440) = uVar5;
                        *(uint *)(ray + k * 4 + 0x480) = uVar100;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar266 = ZEXT416((uint)fVar265);
                        local_340 = vbroadcastss_avx512f(auVar266);
                        auVar188 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar188 = vpermps_avx512f(auVar188,ZEXT1664(auVar108));
                        auVar227 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar227,ZEXT1664(auVar108));
                        local_380 = vbroadcastss_avx512f(auVar108);
                        local_400[0] = (RTCHitN)auVar188[0];
                        local_400[1] = (RTCHitN)auVar188[1];
                        local_400[2] = (RTCHitN)auVar188[2];
                        local_400[3] = (RTCHitN)auVar188[3];
                        local_400[4] = (RTCHitN)auVar188[4];
                        local_400[5] = (RTCHitN)auVar188[5];
                        local_400[6] = (RTCHitN)auVar188[6];
                        local_400[7] = (RTCHitN)auVar188[7];
                        local_400[8] = (RTCHitN)auVar188[8];
                        local_400[9] = (RTCHitN)auVar188[9];
                        local_400[10] = (RTCHitN)auVar188[10];
                        local_400[0xb] = (RTCHitN)auVar188[0xb];
                        local_400[0xc] = (RTCHitN)auVar188[0xc];
                        local_400[0xd] = (RTCHitN)auVar188[0xd];
                        local_400[0xe] = (RTCHitN)auVar188[0xe];
                        local_400[0xf] = (RTCHitN)auVar188[0xf];
                        local_400[0x10] = (RTCHitN)auVar188[0x10];
                        local_400[0x11] = (RTCHitN)auVar188[0x11];
                        local_400[0x12] = (RTCHitN)auVar188[0x12];
                        local_400[0x13] = (RTCHitN)auVar188[0x13];
                        local_400[0x14] = (RTCHitN)auVar188[0x14];
                        local_400[0x15] = (RTCHitN)auVar188[0x15];
                        local_400[0x16] = (RTCHitN)auVar188[0x16];
                        local_400[0x17] = (RTCHitN)auVar188[0x17];
                        local_400[0x18] = (RTCHitN)auVar188[0x18];
                        local_400[0x19] = (RTCHitN)auVar188[0x19];
                        local_400[0x1a] = (RTCHitN)auVar188[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar188[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar188[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar188[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar188[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar188[0x1f];
                        local_400[0x20] = (RTCHitN)auVar188[0x20];
                        local_400[0x21] = (RTCHitN)auVar188[0x21];
                        local_400[0x22] = (RTCHitN)auVar188[0x22];
                        local_400[0x23] = (RTCHitN)auVar188[0x23];
                        local_400[0x24] = (RTCHitN)auVar188[0x24];
                        local_400[0x25] = (RTCHitN)auVar188[0x25];
                        local_400[0x26] = (RTCHitN)auVar188[0x26];
                        local_400[0x27] = (RTCHitN)auVar188[0x27];
                        local_400[0x28] = (RTCHitN)auVar188[0x28];
                        local_400[0x29] = (RTCHitN)auVar188[0x29];
                        local_400[0x2a] = (RTCHitN)auVar188[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar188[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar188[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar188[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar188[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar188[0x2f];
                        local_400[0x30] = (RTCHitN)auVar188[0x30];
                        local_400[0x31] = (RTCHitN)auVar188[0x31];
                        local_400[0x32] = (RTCHitN)auVar188[0x32];
                        local_400[0x33] = (RTCHitN)auVar188[0x33];
                        local_400[0x34] = (RTCHitN)auVar188[0x34];
                        local_400[0x35] = (RTCHitN)auVar188[0x35];
                        local_400[0x36] = (RTCHitN)auVar188[0x36];
                        local_400[0x37] = (RTCHitN)auVar188[0x37];
                        local_400[0x38] = (RTCHitN)auVar188[0x38];
                        local_400[0x39] = (RTCHitN)auVar188[0x39];
                        local_400[0x3a] = (RTCHitN)auVar188[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar188[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar188[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar188[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar188[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar188[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar188 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar188);
                        auVar119 = vpcmpeqd_avx2(auVar188._0_32_,auVar188._0_32_);
                        local_b30[3] = auVar119;
                        local_b30[2] = auVar119;
                        local_b30[1] = auVar119;
                        *local_b30 = auVar119;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar10->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar10->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar254;
                        local_900 = local_4c0;
                        local_b90.valid = (int *)local_900;
                        local_b90.geometryUserPtr = pGVar9->userPtr;
                        local_b90.context = context->user;
                        local_b90.hit = local_400;
                        local_b90.N = 0x10;
                        local_b90.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar251 = ZEXT464((uint)fVar231);
                          auVar261 = ZEXT1664(local_aa0._0_16_);
                          auVar272 = ZEXT1664(auVar172);
                          auVar276 = ZEXT1664(auVar6);
                          (*pGVar9->intersectionFilterN)(&local_b90);
                          auVar260 = ZEXT1664(ZEXT416((uint)fVar254));
                          auVar267 = ZEXT1664(auVar266);
                          auVar278 = ZEXT3264(local_b00);
                          auVar279 = ZEXT3264(local_ae0);
                          auVar268._8_4_ = 0x7fffffff;
                          auVar268._0_8_ = 0x7fffffff7fffffff;
                          auVar268._12_4_ = 0x7fffffff;
                        }
                        auVar158 = vmovdqa64_avx512f(local_900);
                        uVar29 = vptestmd_avx512f(auVar158,auVar158);
                        if ((short)uVar29 != 0) {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar251 = ZEXT1664(auVar251._0_16_);
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            auVar272 = ZEXT1664(auVar272._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            (*p_Var11)(&local_b90);
                            auVar260 = ZEXT1664(ZEXT416((uint)fVar254));
                            auVar267 = ZEXT1664(auVar266);
                            auVar278 = ZEXT3264(local_b00);
                            auVar279 = ZEXT3264(local_ae0);
                            auVar268._8_4_ = 0x7fffffff;
                            auVar268._0_8_ = 0x7fffffff7fffffff;
                            auVar268._12_4_ = 0x7fffffff;
                          }
                          auVar158 = vmovdqa64_avx512f(local_900);
                          uVar103 = vptestmd_avx512f(auVar158,auVar158);
                          if ((short)uVar103 != 0) {
                            iVar3 = *(int *)(local_b90.hit + 4);
                            iVar4 = *(int *)(local_b90.hit + 8);
                            iVar1 = *(int *)(local_b90.hit + 0xc);
                            iVar70 = *(int *)(local_b90.hit + 0x10);
                            iVar71 = *(int *)(local_b90.hit + 0x14);
                            iVar72 = *(int *)(local_b90.hit + 0x18);
                            iVar73 = *(int *)(local_b90.hit + 0x1c);
                            iVar74 = *(int *)(local_b90.hit + 0x20);
                            iVar75 = *(int *)(local_b90.hit + 0x24);
                            iVar76 = *(int *)(local_b90.hit + 0x28);
                            iVar77 = *(int *)(local_b90.hit + 0x2c);
                            iVar78 = *(int *)(local_b90.hit + 0x30);
                            iVar79 = *(int *)(local_b90.hit + 0x34);
                            iVar80 = *(int *)(local_b90.hit + 0x38);
                            iVar81 = *(int *)(local_b90.hit + 0x3c);
                            bVar93 = (byte)uVar103;
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar92 = (byte)(uVar103 >> 8);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x300) =
                                 (uint)(bVar93 & 1) * *(int *)local_b90.hit |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x300);
                            *(uint *)(local_b90.ray + 0x304) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 0x304);
                            *(uint *)(local_b90.ray + 0x308) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x308);
                            *(uint *)(local_b90.ray + 0x30c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x30c);
                            *(uint *)(local_b90.ray + 0x310) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x310);
                            *(uint *)(local_b90.ray + 0x314) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x314);
                            *(uint *)(local_b90.ray + 0x318) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x318);
                            *(uint *)(local_b90.ray + 0x31c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x31c);
                            *(uint *)(local_b90.ray + 800) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 800);
                            *(uint *)(local_b90.ray + 0x324) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x324);
                            *(uint *)(local_b90.ray + 0x328) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x328);
                            *(uint *)(local_b90.ray + 0x32c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x32c);
                            *(uint *)(local_b90.ray + 0x330) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x330);
                            *(uint *)(local_b90.ray + 0x334) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x334);
                            *(uint *)(local_b90.ray + 0x338) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x338);
                            *(uint *)(local_b90.ray + 0x33c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x33c);
                            iVar3 = *(int *)(local_b90.hit + 0x44);
                            iVar4 = *(int *)(local_b90.hit + 0x48);
                            iVar1 = *(int *)(local_b90.hit + 0x4c);
                            iVar70 = *(int *)(local_b90.hit + 0x50);
                            iVar71 = *(int *)(local_b90.hit + 0x54);
                            iVar72 = *(int *)(local_b90.hit + 0x58);
                            iVar73 = *(int *)(local_b90.hit + 0x5c);
                            iVar74 = *(int *)(local_b90.hit + 0x60);
                            iVar75 = *(int *)(local_b90.hit + 100);
                            iVar76 = *(int *)(local_b90.hit + 0x68);
                            iVar77 = *(int *)(local_b90.hit + 0x6c);
                            iVar78 = *(int *)(local_b90.hit + 0x70);
                            iVar79 = *(int *)(local_b90.hit + 0x74);
                            iVar80 = *(int *)(local_b90.hit + 0x78);
                            iVar81 = *(int *)(local_b90.hit + 0x7c);
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x340) =
                                 (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x40) |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x340);
                            *(uint *)(local_b90.ray + 0x344) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 0x344);
                            *(uint *)(local_b90.ray + 0x348) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x348);
                            *(uint *)(local_b90.ray + 0x34c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x34c);
                            *(uint *)(local_b90.ray + 0x350) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x350);
                            *(uint *)(local_b90.ray + 0x354) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x354);
                            *(uint *)(local_b90.ray + 0x358) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x358);
                            *(uint *)(local_b90.ray + 0x35c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x35c);
                            *(uint *)(local_b90.ray + 0x360) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 0x360);
                            *(uint *)(local_b90.ray + 0x364) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x364);
                            *(uint *)(local_b90.ray + 0x368) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x368);
                            *(uint *)(local_b90.ray + 0x36c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x36c);
                            *(uint *)(local_b90.ray + 0x370) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x370);
                            *(uint *)(local_b90.ray + 0x374) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x374);
                            *(uint *)(local_b90.ray + 0x378) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x378);
                            *(uint *)(local_b90.ray + 0x37c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x37c);
                            iVar3 = *(int *)(local_b90.hit + 0x84);
                            iVar4 = *(int *)(local_b90.hit + 0x88);
                            iVar1 = *(int *)(local_b90.hit + 0x8c);
                            iVar70 = *(int *)(local_b90.hit + 0x90);
                            iVar71 = *(int *)(local_b90.hit + 0x94);
                            iVar72 = *(int *)(local_b90.hit + 0x98);
                            iVar73 = *(int *)(local_b90.hit + 0x9c);
                            iVar74 = *(int *)(local_b90.hit + 0xa0);
                            iVar75 = *(int *)(local_b90.hit + 0xa4);
                            iVar76 = *(int *)(local_b90.hit + 0xa8);
                            iVar77 = *(int *)(local_b90.hit + 0xac);
                            iVar78 = *(int *)(local_b90.hit + 0xb0);
                            iVar79 = *(int *)(local_b90.hit + 0xb4);
                            iVar80 = *(int *)(local_b90.hit + 0xb8);
                            iVar81 = *(int *)(local_b90.hit + 0xbc);
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x380) =
                                 (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x80) |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x380);
                            *(uint *)(local_b90.ray + 900) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 900);
                            *(uint *)(local_b90.ray + 0x388) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x388);
                            *(uint *)(local_b90.ray + 0x38c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x38c);
                            *(uint *)(local_b90.ray + 0x390) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x390);
                            *(uint *)(local_b90.ray + 0x394) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x394);
                            *(uint *)(local_b90.ray + 0x398) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x398);
                            *(uint *)(local_b90.ray + 0x39c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x39c);
                            *(uint *)(local_b90.ray + 0x3a0) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 0x3a0);
                            *(uint *)(local_b90.ray + 0x3a4) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x3a4);
                            *(uint *)(local_b90.ray + 0x3a8) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x3a8);
                            *(uint *)(local_b90.ray + 0x3ac) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x3ac);
                            *(uint *)(local_b90.ray + 0x3b0) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x3b0);
                            *(uint *)(local_b90.ray + 0x3b4) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x3b4);
                            *(uint *)(local_b90.ray + 0x3b8) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x3b8);
                            *(uint *)(local_b90.ray + 0x3bc) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x3bc);
                            iVar3 = *(int *)(local_b90.hit + 0xc4);
                            iVar4 = *(int *)(local_b90.hit + 200);
                            iVar1 = *(int *)(local_b90.hit + 0xcc);
                            iVar70 = *(int *)(local_b90.hit + 0xd0);
                            iVar71 = *(int *)(local_b90.hit + 0xd4);
                            iVar72 = *(int *)(local_b90.hit + 0xd8);
                            iVar73 = *(int *)(local_b90.hit + 0xdc);
                            iVar74 = *(int *)(local_b90.hit + 0xe0);
                            iVar75 = *(int *)(local_b90.hit + 0xe4);
                            iVar76 = *(int *)(local_b90.hit + 0xe8);
                            iVar77 = *(int *)(local_b90.hit + 0xec);
                            iVar78 = *(int *)(local_b90.hit + 0xf0);
                            iVar79 = *(int *)(local_b90.hit + 0xf4);
                            iVar80 = *(int *)(local_b90.hit + 0xf8);
                            iVar81 = *(int *)(local_b90.hit + 0xfc);
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x3c0) =
                                 (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0xc0) |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x3c0);
                            *(uint *)(local_b90.ray + 0x3c4) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 0x3c4);
                            *(uint *)(local_b90.ray + 0x3c8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x3c8);
                            *(uint *)(local_b90.ray + 0x3cc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x3cc);
                            *(uint *)(local_b90.ray + 0x3d0) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x3d0);
                            *(uint *)(local_b90.ray + 0x3d4) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x3d4);
                            *(uint *)(local_b90.ray + 0x3d8) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x3d8);
                            *(uint *)(local_b90.ray + 0x3dc) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x3dc);
                            *(uint *)(local_b90.ray + 0x3e0) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 0x3e0);
                            *(uint *)(local_b90.ray + 0x3e4) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x3e4);
                            *(uint *)(local_b90.ray + 1000) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 1000);
                            *(uint *)(local_b90.ray + 0x3ec) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x3ec);
                            *(uint *)(local_b90.ray + 0x3f0) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x3f0);
                            *(uint *)(local_b90.ray + 0x3f4) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x3f4);
                            *(uint *)(local_b90.ray + 0x3f8) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x3f8);
                            *(uint *)(local_b90.ray + 0x3fc) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x3fc);
                            iVar3 = *(int *)(local_b90.hit + 0x104);
                            iVar4 = *(int *)(local_b90.hit + 0x108);
                            iVar1 = *(int *)(local_b90.hit + 0x10c);
                            iVar70 = *(int *)(local_b90.hit + 0x110);
                            iVar71 = *(int *)(local_b90.hit + 0x114);
                            iVar72 = *(int *)(local_b90.hit + 0x118);
                            iVar73 = *(int *)(local_b90.hit + 0x11c);
                            iVar74 = *(int *)(local_b90.hit + 0x120);
                            iVar75 = *(int *)(local_b90.hit + 0x124);
                            iVar76 = *(int *)(local_b90.hit + 0x128);
                            iVar77 = *(int *)(local_b90.hit + 300);
                            iVar78 = *(int *)(local_b90.hit + 0x130);
                            iVar79 = *(int *)(local_b90.hit + 0x134);
                            iVar80 = *(int *)(local_b90.hit + 0x138);
                            iVar81 = *(int *)(local_b90.hit + 0x13c);
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x400) =
                                 (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x100) |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x400);
                            *(uint *)(local_b90.ray + 0x404) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 0x404);
                            *(uint *)(local_b90.ray + 0x408) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x408);
                            *(uint *)(local_b90.ray + 0x40c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x40c);
                            *(uint *)(local_b90.ray + 0x410) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x410);
                            *(uint *)(local_b90.ray + 0x414) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x414);
                            *(uint *)(local_b90.ray + 0x418) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x418);
                            *(uint *)(local_b90.ray + 0x41c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x41c);
                            *(uint *)(local_b90.ray + 0x420) =
                                 (uint)(bVar92 & 1) * iVar74 |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b90.ray + 0x420);
                            *(uint *)(local_b90.ray + 0x424) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x424);
                            *(uint *)(local_b90.ray + 0x428) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x428);
                            *(uint *)(local_b90.ray + 0x42c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x42c);
                            *(uint *)(local_b90.ray + 0x430) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x430);
                            *(uint *)(local_b90.ray + 0x434) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x434);
                            *(uint *)(local_b90.ray + 0x438) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x438);
                            *(uint *)(local_b90.ray + 0x43c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x43c);
                            auVar188 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x140));
                            auVar188 = vmovdqu32_avx512f(auVar188);
                            *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar188;
                            auVar188 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x180));
                            auVar188 = vmovdqu32_avx512f(auVar188);
                            *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar188;
                            auVar227 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x1c0));
                            auVar188 = vmovdqa32_avx512f(auVar227);
                            *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar188;
                            auVar188 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x200));
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            auVar65._4_56_ = auVar188._8_56_;
                            auVar65._0_4_ =
                                 (uint)bVar102 * auVar188._4_4_ | (uint)!bVar102 * auVar227._4_4_;
                            auVar158._0_8_ = auVar65._0_8_ << 0x20;
                            bVar102 = (bool)((byte)(uVar103 >> 2) & 1);
                            auVar158._8_4_ =
                                 (uint)bVar102 * auVar188._8_4_ | (uint)!bVar102 * auVar227._8_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 3) & 1);
                            auVar158._12_4_ =
                                 (uint)bVar102 * auVar188._12_4_ | (uint)!bVar102 * auVar227._12_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 4) & 1);
                            auVar158._16_4_ =
                                 (uint)bVar102 * auVar188._16_4_ | (uint)!bVar102 * auVar227._16_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 5) & 1);
                            auVar158._20_4_ =
                                 (uint)bVar102 * auVar188._20_4_ | (uint)!bVar102 * auVar227._20_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 6) & 1);
                            auVar158._24_4_ =
                                 (uint)bVar102 * auVar188._24_4_ | (uint)!bVar102 * auVar227._24_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 7) & 1);
                            auVar158._28_4_ =
                                 (uint)bVar102 * auVar188._28_4_ | (uint)!bVar102 * auVar227._28_4_;
                            auVar158._32_4_ =
                                 (uint)(bVar92 & 1) * auVar188._32_4_ |
                                 (uint)!(bool)(bVar92 & 1) * auVar227._32_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 9) & 1);
                            auVar158._36_4_ =
                                 (uint)bVar102 * auVar188._36_4_ | (uint)!bVar102 * auVar227._36_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 10) & 1);
                            auVar158._40_4_ =
                                 (uint)bVar102 * auVar188._40_4_ | (uint)!bVar102 * auVar227._40_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            auVar158._44_4_ =
                                 (uint)bVar102 * auVar188._44_4_ | (uint)!bVar102 * auVar227._44_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            auVar158._48_4_ =
                                 (uint)bVar102 * auVar188._48_4_ | (uint)!bVar102 * auVar227._48_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            auVar158._52_4_ =
                                 (uint)bVar102 * auVar188._52_4_ | (uint)!bVar102 * auVar227._52_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            auVar158._56_4_ =
                                 (uint)bVar102 * auVar188._56_4_ | (uint)!bVar102 * auVar227._56_4_;
                            bVar102 = SUB81(uVar103 >> 0xf,0);
                            auVar158._60_4_ =
                                 (uint)bVar102 * auVar188._60_4_ | (uint)!bVar102 * auVar227._60_4_;
                            auVar188 = vmovdqa32_avx512f(auVar188);
                            *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar188;
                            goto LAB_01d496fe;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar255;
                      }
                    }
                  }
                }
LAB_01d496fe:
                auVar117 = auVar158._32_32_;
                bVar102 = lVar101 != 0;
                lVar101 = lVar101 + -1;
              } while ((!bVar12) && (bVar102));
              auVar84._4_4_ = fStack_87c;
              auVar84._0_4_ = local_880;
              auVar84._8_4_ = fStack_878;
              auVar84._12_4_ = fStack_874;
              auVar84._16_4_ = fStack_870;
              auVar84._20_4_ = fStack_86c;
              auVar84._24_4_ = fStack_868;
              auVar84._28_4_ = fStack_864;
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar38._4_4_ = uVar8;
              auVar38._0_4_ = uVar8;
              auVar38._8_4_ = uVar8;
              auVar38._12_4_ = uVar8;
              auVar38._16_4_ = uVar8;
              auVar38._20_4_ = uVar8;
              auVar38._24_4_ = uVar8;
              auVar38._28_4_ = uVar8;
              uVar29 = vcmpps_avx512vl(auVar84,auVar38,2);
              bVar97 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar97 & (byte)uVar29;
            } while (bVar97 != 0);
          }
          auVar184._0_4_ = (float)local_8a0._0_4_ + (float)local_940._0_4_;
          auVar184._4_4_ = (float)local_8a0._4_4_ + (float)local_940._4_4_;
          auVar184._8_4_ = fStack_898 + fStack_938;
          auVar184._12_4_ = fStack_894 + fStack_934;
          auVar184._16_4_ = fStack_890 + fStack_930;
          auVar184._20_4_ = fStack_88c + fStack_92c;
          auVar184._24_4_ = fStack_888 + fStack_928;
          auVar184._28_4_ = fStack_884 + fStack_924;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar39._4_4_ = uVar8;
          auVar39._0_4_ = uVar8;
          auVar39._8_4_ = uVar8;
          auVar39._12_4_ = uVar8;
          auVar39._16_4_ = uVar8;
          auVar39._20_4_ = uVar8;
          auVar39._24_4_ = uVar8;
          auVar39._28_4_ = uVar8;
          uVar29 = vcmpps_avx512vl(auVar184,auVar39,2);
          bVar98 = (byte)uVar27 | ~bVar98;
          bVar91 = (byte)uVar28 & bVar91 & (byte)uVar29;
          auVar185._8_4_ = 2;
          auVar185._0_8_ = 0x200000002;
          auVar185._12_4_ = 2;
          auVar185._16_4_ = 2;
          auVar185._20_4_ = 2;
          auVar185._24_4_ = 2;
          auVar185._28_4_ = 2;
          auVar40._8_4_ = 3;
          auVar40._0_8_ = 0x300000003;
          auVar40._12_4_ = 3;
          auVar40._16_4_ = 3;
          auVar40._20_4_ = 3;
          auVar40._24_4_ = 3;
          auVar40._28_4_ = 3;
          auVar119 = vpblendmd_avx512vl(auVar185,auVar40);
          local_8a0._0_4_ = (uint)(bVar98 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar98 & 1) * 2;
          bVar12 = (bool)(bVar98 >> 1 & 1);
          local_8a0._4_4_ = (uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar98 >> 2 & 1);
          fStack_898 = (float)((uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar98 >> 3 & 1);
          fStack_894 = (float)((uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar98 >> 4 & 1);
          fStack_890 = (float)((uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar98 >> 5 & 1);
          fStack_88c = (float)((uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar98 >> 6 & 1);
          fStack_888 = (float)((uint)bVar12 * auVar119._24_4_ | (uint)!bVar12 * 2);
          fStack_884 = (float)((uint)(bVar98 >> 7) * auVar119._28_4_ |
                              (uint)!(bool)(bVar98 >> 7) * 2);
          auVar161._32_32_ = auVar117;
          auVar161._0_32_ = _local_8a0;
          uVar27 = vpcmpd_avx512vl(_local_8a0,local_820,2);
          bVar98 = (byte)uVar27 & bVar91;
          if (bVar98 != 0) {
            auVar266 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar108 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar105 = vminps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar6 = vminps_avx(auVar266,auVar105);
            auVar266 = vmaxps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar105 = vmaxps_avx(auVar108,auVar266);
            auVar108 = vandps_avx(auVar268,auVar6);
            auVar266 = vandps_avx(auVar268,auVar105);
            auVar108 = vmaxps_avx(auVar108,auVar266);
            auVar266 = vmovshdup_avx(auVar108);
            auVar266 = vmaxss_avx(auVar266,auVar108);
            auVar108 = vshufpd_avx(auVar108,auVar108,1);
            auVar108 = vmaxss_avx(auVar108,auVar266);
            fVar169 = auVar108._0_4_ * 1.9073486e-06;
            local_9d0 = vshufps_avx(auVar105,auVar105,0xff);
            _local_960 = _local_7c0;
            local_880 = (float)local_7c0._0_4_ + (float)local_940._0_4_;
            fStack_87c = (float)local_7c0._4_4_ + (float)local_940._4_4_;
            fStack_878 = fStack_7b8 + fStack_938;
            fStack_874 = fStack_7b4 + fStack_934;
            fStack_870 = fStack_7b0 + fStack_930;
            fStack_86c = fStack_7ac + fStack_92c;
            fStack_868 = fStack_7a8 + fStack_928;
            fStack_864 = fStack_7a4 + fStack_924;
            do {
              auVar186._8_4_ = 0x7f800000;
              auVar186._0_8_ = 0x7f8000007f800000;
              auVar186._12_4_ = 0x7f800000;
              auVar186._16_4_ = 0x7f800000;
              auVar186._20_4_ = 0x7f800000;
              auVar186._24_4_ = 0x7f800000;
              auVar186._28_4_ = 0x7f800000;
              auVar119 = vblendmps_avx512vl(auVar186,_local_960);
              auVar154._0_4_ =
                   (uint)(bVar98 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar98 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar98 >> 1 & 1);
              auVar154._4_4_ = (uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar98 >> 2 & 1);
              auVar154._8_4_ = (uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar98 >> 3 & 1);
              auVar154._12_4_ = (uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar98 >> 4 & 1);
              auVar154._16_4_ = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar98 >> 5 & 1);
              auVar154._20_4_ = (uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar154._24_4_ =
                   (uint)(bVar98 >> 6) * auVar119._24_4_ | (uint)!(bool)(bVar98 >> 6) * 0x7f800000;
              auVar154._28_4_ = 0x7f800000;
              auVar161._0_32_ = auVar154;
              auVar119 = vshufps_avx(auVar154,auVar154,0xb1);
              auVar119 = vminps_avx(auVar154,auVar119);
              auVar117 = vshufpd_avx(auVar119,auVar119,5);
              auVar119 = vminps_avx(auVar119,auVar117);
              auVar117 = vpermpd_avx2(auVar119,0x4e);
              auVar119 = vminps_avx(auVar119,auVar117);
              uVar27 = vcmpps_avx512vl(auVar154,auVar119,0);
              bVar93 = (byte)uVar27 & bVar98;
              bVar97 = bVar98;
              if (bVar93 != 0) {
                bVar97 = bVar93;
              }
              iVar2 = 0;
              for (uVar104 = (uint)bVar97; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000)
              {
                iVar2 = iVar2 + 1;
              }
              uVar104 = *(uint *)(local_860 + (uint)(iVar2 << 2));
              uVar162 = *(uint *)(local_7a0 + (uint)(iVar2 << 2));
              fVar253 = auVar107._0_4_;
              if ((float)local_a80._0_4_ < 0.0) {
                fVar253 = sqrtf((float)local_a80._0_4_);
              }
              auVar267 = ZEXT464(uVar104);
              auVar261 = ZEXT464(uVar162);
              lVar101 = 4;
              do {
                auVar119 = auVar161._32_32_;
                fVar254 = auVar261._0_4_;
                auVar175._4_4_ = fVar254;
                auVar175._0_4_ = fVar254;
                auVar175._8_4_ = fVar254;
                auVar175._12_4_ = fVar254;
                auVar108 = vfmadd132ps_fma(auVar175,ZEXT816(0) << 0x40,local_a70);
                fVar265 = auVar267._0_4_;
                fVar250 = 1.0 - fVar265;
                fVar263 = fVar250 * fVar250 * fVar250;
                fVar255 = fVar265 * fVar265;
                fVar256 = fVar265 * fVar255;
                auVar266 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar263),
                                           ZEXT416((uint)fVar256));
                fVar262 = fVar265 * fVar250;
                auVar106 = ZEXT416((uint)fVar250);
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar265 * fVar262 * 6.0)),
                                         ZEXT416((uint)(fVar262 * fVar250)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar256),
                                           ZEXT416((uint)fVar263));
                auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar262 * fVar250 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar265 * fVar262)));
                fVar263 = fVar263 * 0.16666667;
                fVar264 = (auVar266._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar231 = (auVar105._0_4_ + auVar109._0_4_) * 0.16666667;
                fVar256 = fVar256 * 0.16666667;
                auVar220._0_4_ = fVar256 * (float)local_a60._0_4_;
                auVar220._4_4_ = fVar256 * (float)local_a60._4_4_;
                auVar220._8_4_ = fVar256 * fStack_a58;
                auVar220._12_4_ = fVar256 * fStack_a54;
                auVar243._4_4_ = fVar231;
                auVar243._0_4_ = fVar231;
                auVar243._8_4_ = fVar231;
                auVar243._12_4_ = fVar231;
                auVar266 = vfmadd132ps_fma(auVar243,auVar220,local_a20._0_16_);
                auVar221._4_4_ = fVar264;
                auVar221._0_4_ = fVar264;
                auVar221._8_4_ = fVar264;
                auVar221._12_4_ = fVar264;
                auVar266 = vfmadd132ps_fma(auVar221,auVar266,local_a40._0_16_);
                auVar202._4_4_ = fVar263;
                auVar202._0_4_ = fVar263;
                auVar202._8_4_ = fVar263;
                auVar202._12_4_ = fVar263;
                auVar266 = vfmadd132ps_fma(auVar202,auVar266,local_a00._0_16_);
                local_920._0_16_ = auVar266;
                auVar108 = vsubps_avx(auVar108,auVar266);
                local_aa0._0_16_ = auVar108;
                auVar108 = vdpps_avx(auVar108,auVar108,0x7f);
                auVar266 = auVar267._0_16_;
                local_ac0._0_16_ = auVar108;
                if (auVar108._0_4_ < 0.0) {
                  local_b60._0_4_ = fVar255;
                  auVar260._0_4_ = sqrtf(auVar108._0_4_);
                  auVar260._4_60_ = extraout_var_01;
                  auVar108 = auVar260._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  local_b60._0_4_ = fVar255;
                }
                auVar6 = vfnmsub213ss_fma(auVar266,auVar266,ZEXT416((uint)(fVar262 * 4.0)));
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar262 * 4.0)),auVar106,auVar106);
                fVar255 = fVar250 * -fVar250 * 0.5;
                fVar262 = auVar6._0_4_ * 0.5;
                fVar263 = auVar105._0_4_ * 0.5;
                local_b60._0_4_ = (float)local_b60._0_4_ * 0.5;
                auVar235._0_4_ = (float)local_b60._0_4_ * (float)local_a60._0_4_;
                auVar235._4_4_ = (float)local_b60._0_4_ * (float)local_a60._4_4_;
                auVar235._8_4_ = (float)local_b60._0_4_ * fStack_a58;
                auVar235._12_4_ = (float)local_b60._0_4_ * fStack_a54;
                auVar203._4_4_ = fVar263;
                auVar203._0_4_ = fVar263;
                auVar203._8_4_ = fVar263;
                auVar203._12_4_ = fVar263;
                auVar105 = vfmadd132ps_fma(auVar203,auVar235,local_a20._0_16_);
                auVar222._4_4_ = fVar262;
                auVar222._0_4_ = fVar262;
                auVar222._8_4_ = fVar262;
                auVar222._12_4_ = fVar262;
                auVar105 = vfmadd132ps_fma(auVar222,auVar105,local_a40._0_16_);
                auVar274._4_4_ = fVar255;
                auVar274._0_4_ = fVar255;
                auVar274._8_4_ = fVar255;
                auVar274._12_4_ = fVar255;
                local_b60._0_16_ = vfmadd132ps_fma(auVar274,auVar105,local_a00._0_16_);
                local_980 = vdpps_avx(local_b60._0_16_,local_b60._0_16_,0x7f);
                auVar69._12_4_ = 0;
                auVar69._0_12_ = ZEXT812(0);
                fVar255 = local_980._0_4_;
                auVar105 = vrsqrt14ss_avx512f(auVar69 << 0x20,ZEXT416((uint)fVar255));
                fVar262 = auVar105._0_4_;
                local_990 = vrcp14ss_avx512f(auVar69 << 0x20,ZEXT416((uint)fVar255));
                auVar105 = vfnmadd213ss_fma(local_990,local_980,ZEXT416(0x40000000));
                uVar104 = auVar108._0_4_;
                local_970 = fVar250;
                fStack_96c = fVar250;
                fStack_968 = fVar250;
                fStack_964 = fVar250;
                if (fVar255 < -fVar255) {
                  auVar261._0_4_ = sqrtf(fVar255);
                  auVar261._4_60_ = extraout_var_02;
                  auVar108 = ZEXT416(uVar104);
                  auVar109 = auVar261._0_16_;
                  auVar6 = local_b60._0_16_;
                }
                else {
                  auVar109 = vsqrtss_avx512f(local_980,local_980);
                  auVar6 = local_b60._0_16_;
                }
                fVar255 = fVar262 * 1.5 + fVar255 * -0.5 * fVar262 * fVar262 * fVar262;
                auVar176._0_4_ = auVar6._0_4_ * fVar255;
                auVar176._4_4_ = auVar6._4_4_ * fVar255;
                auVar176._8_4_ = auVar6._8_4_ * fVar255;
                auVar176._12_4_ = auVar6._12_4_ * fVar255;
                auVar277 = vdpps_avx(local_aa0._0_16_,auVar176,0x7f);
                fVar264 = auVar108._0_4_;
                fVar262 = auVar277._0_4_;
                auVar177._0_4_ = fVar262 * fVar262;
                auVar177._4_4_ = auVar277._4_4_ * auVar277._4_4_;
                auVar177._8_4_ = auVar277._8_4_ * auVar277._8_4_;
                auVar177._12_4_ = auVar277._12_4_ * auVar277._12_4_;
                auVar110 = vsubps_avx512vl(local_ac0._0_16_,auVar177);
                fVar263 = auVar110._0_4_;
                auVar204._4_12_ = ZEXT812(0) << 0x20;
                auVar204._0_4_ = fVar263;
                auVar111 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
                auVar112 = vmulss_avx512f(auVar111,ZEXT416(0x3fc00000));
                auVar113 = vmulss_avx512f(auVar110,ZEXT416(0xbf000000));
                if (fVar263 < 0.0) {
                  local_9b0 = fVar255;
                  fStack_9ac = fVar255;
                  fStack_9a8 = fVar255;
                  fStack_9a4 = fVar255;
                  local_9a0 = auVar111;
                  fVar263 = sqrtf(fVar263);
                  auVar113 = ZEXT416(auVar113._0_4_);
                  auVar112 = ZEXT416(auVar112._0_4_);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar108 = ZEXT416(uVar104);
                  auVar6 = local_b60._0_16_;
                  auVar111 = local_9a0;
                  fVar255 = local_9b0;
                  fVar231 = fStack_9ac;
                  fVar256 = fStack_9a8;
                  fVar250 = fStack_9a4;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar110,auVar110);
                  fVar263 = auVar110._0_4_;
                  fVar231 = fVar255;
                  fVar256 = fVar255;
                  fVar250 = fVar255;
                }
                auVar276 = ZEXT1664(auVar6);
                auVar259._8_4_ = 0x7fffffff;
                auVar259._0_8_ = 0x7fffffff7fffffff;
                auVar259._12_4_ = 0x7fffffff;
                auVar260 = ZEXT1664(auVar259);
                auVar279 = ZEXT3264(local_ae0);
                auVar267._32_32_ = auVar119;
                auVar267._0_32_ = local_b00;
                auVar278 = ZEXT3264(local_b00);
                auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar106,auVar266);
                auVar266 = vfmadd231ss_fma(auVar106,auVar266,SUB6416(ZEXT464(0xc0000000),0));
                auVar223._0_4_ = fVar265 * (float)local_a60._0_4_;
                auVar223._4_4_ = fVar265 * (float)local_a60._4_4_;
                auVar223._8_4_ = fVar265 * fStack_a58;
                auVar223._12_4_ = fVar265 * fStack_a54;
                auVar236._0_4_ = auVar266._0_4_;
                auVar236._4_4_ = auVar236._0_4_;
                auVar236._8_4_ = auVar236._0_4_;
                auVar236._12_4_ = auVar236._0_4_;
                auVar266 = vfmadd132ps_fma(auVar236,auVar223,local_a20._0_16_);
                auVar205._0_4_ = auVar110._0_4_;
                auVar205._4_4_ = auVar205._0_4_;
                auVar205._8_4_ = auVar205._0_4_;
                auVar205._12_4_ = auVar205._0_4_;
                auVar266 = vfmadd132ps_fma(auVar205,auVar266,local_a40._0_16_);
                auVar83._4_4_ = fStack_96c;
                auVar83._0_4_ = local_970;
                auVar83._8_4_ = fStack_968;
                auVar83._12_4_ = fStack_964;
                auVar266 = vfmadd132ps_fma(auVar83,auVar266,local_a00._0_16_);
                auVar206._0_4_ = auVar266._0_4_ * (float)local_980._0_4_;
                auVar206._4_4_ = auVar266._4_4_ * (float)local_980._0_4_;
                auVar206._8_4_ = auVar266._8_4_ * (float)local_980._0_4_;
                auVar206._12_4_ = auVar266._12_4_ * (float)local_980._0_4_;
                auVar266 = vdpps_avx(auVar6,auVar266,0x7f);
                fVar214 = auVar266._0_4_;
                auVar224._0_4_ = auVar6._0_4_ * fVar214;
                auVar224._4_4_ = auVar6._4_4_ * fVar214;
                auVar224._8_4_ = auVar6._8_4_ * fVar214;
                auVar224._12_4_ = auVar6._12_4_ * fVar214;
                auVar266 = vsubps_avx(auVar206,auVar224);
                fVar214 = auVar105._0_4_ * (float)local_990._0_4_;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar161._16_48_ = auVar267._16_48_;
                auVar110 = vxorps_avx512vl(auVar6,auVar31);
                auVar244._0_4_ = fVar255 * auVar266._0_4_ * fVar214;
                auVar244._4_4_ = fVar231 * auVar266._4_4_ * fVar214;
                auVar244._8_4_ = fVar256 * auVar266._8_4_ * fVar214;
                auVar244._12_4_ = fVar250 * auVar266._12_4_ * fVar214;
                auVar272 = ZEXT1664(auVar176);
                auVar266 = vdpps_avx(auVar110,auVar176,0x7f);
                auVar106 = vmaxss_avx(ZEXT416((uint)fVar169),
                                      ZEXT416((uint)(fVar254 * fVar253 * 1.9073486e-06)));
                auVar109 = vdivss_avx512f(ZEXT416((uint)fVar169),auVar109);
                auVar105 = vdpps_avx(local_aa0._0_16_,auVar244,0x7f);
                auVar108 = vfmadd213ss_fma(auVar108,ZEXT416((uint)fVar169),auVar106);
                auVar109 = vfmadd213ss_fma(ZEXT416((uint)(fVar264 + 1.0)),auVar109,auVar108);
                auVar108 = vdpps_avx(local_a70,auVar176,0x7f);
                fVar255 = auVar266._0_4_ + auVar105._0_4_;
                auVar266 = vdpps_avx(local_aa0._0_16_,auVar110,0x7f);
                auVar110 = vmulss_avx512f(auVar113,auVar111);
                auVar111 = vmulss_avx512f(auVar111,auVar111);
                auVar105 = vdpps_avx(local_aa0._0_16_,local_a70,0x7f);
                auVar161._0_16_ =
                     vaddss_avx512f(auVar112,ZEXT416((uint)(auVar110._0_4_ * auVar111._0_4_)));
                auVar111 = vfnmadd231ss_fma(auVar266,auVar277,ZEXT416((uint)fVar255));
                auVar110 = vfnmadd231ss_fma(auVar105,auVar277,auVar108);
                auVar266 = vpermilps_avx(local_920._0_16_,0xff);
                fVar263 = fVar263 - auVar266._0_4_;
                auVar266 = vshufps_avx(auVar6,auVar6,0xff);
                auVar105 = vfmsub213ss_fma(auVar111,auVar161._0_16_,auVar266);
                fVar264 = auVar110._0_4_ * auVar161._0_4_;
                auVar111 = vfmsub231ss_fma(ZEXT416((uint)(auVar108._0_4_ * auVar105._0_4_)),
                                           ZEXT416((uint)fVar255),ZEXT416((uint)fVar264));
                fVar256 = auVar111._0_4_;
                fVar231 = fVar262 * (auVar105._0_4_ / fVar256);
                auVar251 = ZEXT464((uint)fVar231);
                fVar265 = fVar265 - (fVar262 * (fVar264 / fVar256) -
                                    fVar263 * (auVar108._0_4_ / fVar256));
                auVar267 = ZEXT464((uint)fVar265);
                fVar254 = fVar254 - (fVar263 * (fVar255 / fVar256) - fVar231);
                auVar261 = ZEXT464((uint)fVar254);
                auVar108 = vandps_avx(auVar277,auVar259);
                if (auVar109._0_4_ <= auVar108._0_4_) {
LAB_01d4a306:
                  bVar12 = false;
                }
                else {
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(auVar109._0_4_ + auVar106._0_4_)),
                                             local_9d0,ZEXT416(0x36000000));
                  auVar108 = vandps_avx(auVar259,ZEXT416((uint)fVar263));
                  if (auVar105._0_4_ <= auVar108._0_4_) goto LAB_01d4a306;
                  fVar254 = fVar254 + (float)local_9c0._0_4_;
                  auVar261 = ZEXT464((uint)fVar254);
                  bVar12 = true;
                  if ((((fVar232 <= fVar254) &&
                       (fVar255 = *(float *)(ray + k * 4 + 0x200), fVar254 <= fVar255)) &&
                      (0.0 <= fVar265)) && (fVar265 <= 1.0)) {
                    auVar160._16_48_ = auVar161._16_48_;
                    auVar160._0_16_ = ZEXT816(0) << 0x20;
                    auVar159._4_60_ = auVar160._4_60_;
                    auVar159._0_4_ = local_ac0._0_4_;
                    auVar108 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar159._0_16_);
                    fVar262 = auVar108._0_4_;
                    auVar161._0_16_ = vmulss_avx512f(local_ac0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar100].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar262 = fVar262 * 1.5 + auVar161._0_4_ * fVar262 * fVar262 * fVar262;
                      auVar207._0_4_ = local_aa0._0_4_ * fVar262;
                      auVar207._4_4_ = local_aa0._4_4_ * fVar262;
                      auVar207._8_4_ = local_aa0._8_4_ * fVar262;
                      auVar207._12_4_ = local_aa0._12_4_ * fVar262;
                      auVar109 = vfmadd213ps_fma(auVar266,auVar207,auVar6);
                      auVar108 = vshufps_avx(auVar207,auVar207,0xc9);
                      auVar266 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar208._0_4_ = auVar207._0_4_ * auVar266._0_4_;
                      auVar208._4_4_ = auVar207._4_4_ * auVar266._4_4_;
                      auVar208._8_4_ = auVar207._8_4_ * auVar266._8_4_;
                      auVar208._12_4_ = auVar207._12_4_ * auVar266._12_4_;
                      auVar105 = vfmsub231ps_fma(auVar208,auVar6,auVar108);
                      auVar108 = vshufps_avx(auVar105,auVar105,0xc9);
                      auVar266 = vshufps_avx(auVar109,auVar109,0xc9);
                      auVar105 = vshufps_avx(auVar105,auVar105,0xd2);
                      auVar178._0_4_ = auVar109._0_4_ * auVar105._0_4_;
                      auVar178._4_4_ = auVar109._4_4_ * auVar105._4_4_;
                      auVar178._8_4_ = auVar109._8_4_ * auVar105._8_4_;
                      auVar178._12_4_ = auVar109._12_4_ * auVar105._12_4_;
                      auVar108 = vfmsub231ps_fma(auVar178,auVar108,auVar266);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar254;
                        uVar8 = vextractps_avx(auVar108,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar8;
                        uVar8 = vextractps_avx(auVar108,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar8;
                        *(int *)(ray + k * 4 + 0x380) = auVar108._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar265;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x440) = uVar5;
                        *(uint *)(ray + k * 4 + 0x480) = uVar100;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar266 = ZEXT416((uint)fVar265);
                        local_340 = vbroadcastss_avx512f(auVar266);
                        auVar188 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar188 = vpermps_avx512f(auVar188,ZEXT1664(auVar108));
                        auVar227 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar227,ZEXT1664(auVar108));
                        local_380 = vbroadcastss_avx512f(auVar108);
                        local_400[0] = (RTCHitN)auVar188[0];
                        local_400[1] = (RTCHitN)auVar188[1];
                        local_400[2] = (RTCHitN)auVar188[2];
                        local_400[3] = (RTCHitN)auVar188[3];
                        local_400[4] = (RTCHitN)auVar188[4];
                        local_400[5] = (RTCHitN)auVar188[5];
                        local_400[6] = (RTCHitN)auVar188[6];
                        local_400[7] = (RTCHitN)auVar188[7];
                        local_400[8] = (RTCHitN)auVar188[8];
                        local_400[9] = (RTCHitN)auVar188[9];
                        local_400[10] = (RTCHitN)auVar188[10];
                        local_400[0xb] = (RTCHitN)auVar188[0xb];
                        local_400[0xc] = (RTCHitN)auVar188[0xc];
                        local_400[0xd] = (RTCHitN)auVar188[0xd];
                        local_400[0xe] = (RTCHitN)auVar188[0xe];
                        local_400[0xf] = (RTCHitN)auVar188[0xf];
                        local_400[0x10] = (RTCHitN)auVar188[0x10];
                        local_400[0x11] = (RTCHitN)auVar188[0x11];
                        local_400[0x12] = (RTCHitN)auVar188[0x12];
                        local_400[0x13] = (RTCHitN)auVar188[0x13];
                        local_400[0x14] = (RTCHitN)auVar188[0x14];
                        local_400[0x15] = (RTCHitN)auVar188[0x15];
                        local_400[0x16] = (RTCHitN)auVar188[0x16];
                        local_400[0x17] = (RTCHitN)auVar188[0x17];
                        local_400[0x18] = (RTCHitN)auVar188[0x18];
                        local_400[0x19] = (RTCHitN)auVar188[0x19];
                        local_400[0x1a] = (RTCHitN)auVar188[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar188[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar188[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar188[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar188[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar188[0x1f];
                        local_400[0x20] = (RTCHitN)auVar188[0x20];
                        local_400[0x21] = (RTCHitN)auVar188[0x21];
                        local_400[0x22] = (RTCHitN)auVar188[0x22];
                        local_400[0x23] = (RTCHitN)auVar188[0x23];
                        local_400[0x24] = (RTCHitN)auVar188[0x24];
                        local_400[0x25] = (RTCHitN)auVar188[0x25];
                        local_400[0x26] = (RTCHitN)auVar188[0x26];
                        local_400[0x27] = (RTCHitN)auVar188[0x27];
                        local_400[0x28] = (RTCHitN)auVar188[0x28];
                        local_400[0x29] = (RTCHitN)auVar188[0x29];
                        local_400[0x2a] = (RTCHitN)auVar188[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar188[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar188[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar188[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar188[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar188[0x2f];
                        local_400[0x30] = (RTCHitN)auVar188[0x30];
                        local_400[0x31] = (RTCHitN)auVar188[0x31];
                        local_400[0x32] = (RTCHitN)auVar188[0x32];
                        local_400[0x33] = (RTCHitN)auVar188[0x33];
                        local_400[0x34] = (RTCHitN)auVar188[0x34];
                        local_400[0x35] = (RTCHitN)auVar188[0x35];
                        local_400[0x36] = (RTCHitN)auVar188[0x36];
                        local_400[0x37] = (RTCHitN)auVar188[0x37];
                        local_400[0x38] = (RTCHitN)auVar188[0x38];
                        local_400[0x39] = (RTCHitN)auVar188[0x39];
                        local_400[0x3a] = (RTCHitN)auVar188[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar188[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar188[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar188[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar188[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar188[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar188 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar188);
                        auVar119 = vpcmpeqd_avx2(auVar188._0_32_,auVar188._0_32_);
                        local_b30[3] = auVar119;
                        local_b30[2] = auVar119;
                        local_b30[1] = auVar119;
                        *local_b30 = auVar119;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar10->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar10->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar254;
                        local_900 = local_4c0;
                        local_b90.valid = (int *)local_900;
                        local_b90.geometryUserPtr = pGVar9->userPtr;
                        local_b90.context = context->user;
                        local_b90.hit = local_400;
                        local_b90.N = 0x10;
                        local_b90.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar251 = ZEXT464((uint)fVar231);
                          auVar260 = ZEXT1664(auVar259);
                          auVar272 = ZEXT1664(auVar176);
                          auVar276 = ZEXT1664(auVar6);
                          (*pGVar9->intersectionFilterN)(&local_b90);
                          auVar261 = ZEXT1664(ZEXT416((uint)fVar254));
                          auVar267 = ZEXT1664(auVar266);
                          auVar278 = ZEXT3264(local_b00);
                          auVar279 = ZEXT3264(local_ae0);
                        }
                        auVar161 = vmovdqa64_avx512f(local_900);
                        uVar27 = vptestmd_avx512f(auVar161,auVar161);
                        if ((short)uVar27 != 0) {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar251 = ZEXT1664(auVar251._0_16_);
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar272 = ZEXT1664(auVar272._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            (*p_Var11)(&local_b90);
                            auVar261 = ZEXT1664(ZEXT416((uint)fVar254));
                            auVar267 = ZEXT1664(auVar266);
                            auVar278 = ZEXT3264(local_b00);
                            auVar279 = ZEXT3264(local_ae0);
                          }
                          auVar161 = vmovdqa64_avx512f(local_900);
                          uVar103 = vptestmd_avx512f(auVar161,auVar161);
                          if ((short)uVar103 != 0) {
                            iVar3 = *(int *)(local_b90.hit + 4);
                            iVar4 = *(int *)(local_b90.hit + 8);
                            iVar1 = *(int *)(local_b90.hit + 0xc);
                            iVar70 = *(int *)(local_b90.hit + 0x10);
                            iVar71 = *(int *)(local_b90.hit + 0x14);
                            iVar72 = *(int *)(local_b90.hit + 0x18);
                            iVar73 = *(int *)(local_b90.hit + 0x1c);
                            iVar74 = *(int *)(local_b90.hit + 0x20);
                            iVar75 = *(int *)(local_b90.hit + 0x24);
                            iVar76 = *(int *)(local_b90.hit + 0x28);
                            iVar77 = *(int *)(local_b90.hit + 0x2c);
                            iVar78 = *(int *)(local_b90.hit + 0x30);
                            iVar79 = *(int *)(local_b90.hit + 0x34);
                            iVar80 = *(int *)(local_b90.hit + 0x38);
                            iVar81 = *(int *)(local_b90.hit + 0x3c);
                            bVar97 = (byte)uVar103;
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar93 = (byte)(uVar103 >> 8);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x300) =
                                 (uint)(bVar97 & 1) * *(int *)local_b90.hit |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b90.ray + 0x300);
                            *(uint *)(local_b90.ray + 0x304) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 0x304);
                            *(uint *)(local_b90.ray + 0x308) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x308);
                            *(uint *)(local_b90.ray + 0x30c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x30c);
                            *(uint *)(local_b90.ray + 0x310) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x310);
                            *(uint *)(local_b90.ray + 0x314) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x314);
                            *(uint *)(local_b90.ray + 0x318) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x318);
                            *(uint *)(local_b90.ray + 0x31c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x31c);
                            *(uint *)(local_b90.ray + 800) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 800);
                            *(uint *)(local_b90.ray + 0x324) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x324);
                            *(uint *)(local_b90.ray + 0x328) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x328);
                            *(uint *)(local_b90.ray + 0x32c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x32c);
                            *(uint *)(local_b90.ray + 0x330) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x330);
                            *(uint *)(local_b90.ray + 0x334) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x334);
                            *(uint *)(local_b90.ray + 0x338) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x338);
                            *(uint *)(local_b90.ray + 0x33c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x33c);
                            iVar3 = *(int *)(local_b90.hit + 0x44);
                            iVar4 = *(int *)(local_b90.hit + 0x48);
                            iVar1 = *(int *)(local_b90.hit + 0x4c);
                            iVar70 = *(int *)(local_b90.hit + 0x50);
                            iVar71 = *(int *)(local_b90.hit + 0x54);
                            iVar72 = *(int *)(local_b90.hit + 0x58);
                            iVar73 = *(int *)(local_b90.hit + 0x5c);
                            iVar74 = *(int *)(local_b90.hit + 0x60);
                            iVar75 = *(int *)(local_b90.hit + 100);
                            iVar76 = *(int *)(local_b90.hit + 0x68);
                            iVar77 = *(int *)(local_b90.hit + 0x6c);
                            iVar78 = *(int *)(local_b90.hit + 0x70);
                            iVar79 = *(int *)(local_b90.hit + 0x74);
                            iVar80 = *(int *)(local_b90.hit + 0x78);
                            iVar81 = *(int *)(local_b90.hit + 0x7c);
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x340) =
                                 (uint)(bVar97 & 1) * *(int *)(local_b90.hit + 0x40) |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b90.ray + 0x340);
                            *(uint *)(local_b90.ray + 0x344) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 0x344);
                            *(uint *)(local_b90.ray + 0x348) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x348);
                            *(uint *)(local_b90.ray + 0x34c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x34c);
                            *(uint *)(local_b90.ray + 0x350) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x350);
                            *(uint *)(local_b90.ray + 0x354) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x354);
                            *(uint *)(local_b90.ray + 0x358) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x358);
                            *(uint *)(local_b90.ray + 0x35c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x35c);
                            *(uint *)(local_b90.ray + 0x360) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x360);
                            *(uint *)(local_b90.ray + 0x364) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x364);
                            *(uint *)(local_b90.ray + 0x368) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x368);
                            *(uint *)(local_b90.ray + 0x36c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x36c);
                            *(uint *)(local_b90.ray + 0x370) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x370);
                            *(uint *)(local_b90.ray + 0x374) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x374);
                            *(uint *)(local_b90.ray + 0x378) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x378);
                            *(uint *)(local_b90.ray + 0x37c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x37c);
                            iVar3 = *(int *)(local_b90.hit + 0x84);
                            iVar4 = *(int *)(local_b90.hit + 0x88);
                            iVar1 = *(int *)(local_b90.hit + 0x8c);
                            iVar70 = *(int *)(local_b90.hit + 0x90);
                            iVar71 = *(int *)(local_b90.hit + 0x94);
                            iVar72 = *(int *)(local_b90.hit + 0x98);
                            iVar73 = *(int *)(local_b90.hit + 0x9c);
                            iVar74 = *(int *)(local_b90.hit + 0xa0);
                            iVar75 = *(int *)(local_b90.hit + 0xa4);
                            iVar76 = *(int *)(local_b90.hit + 0xa8);
                            iVar77 = *(int *)(local_b90.hit + 0xac);
                            iVar78 = *(int *)(local_b90.hit + 0xb0);
                            iVar79 = *(int *)(local_b90.hit + 0xb4);
                            iVar80 = *(int *)(local_b90.hit + 0xb8);
                            iVar81 = *(int *)(local_b90.hit + 0xbc);
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x380) =
                                 (uint)(bVar97 & 1) * *(int *)(local_b90.hit + 0x80) |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b90.ray + 0x380);
                            *(uint *)(local_b90.ray + 900) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 900);
                            *(uint *)(local_b90.ray + 0x388) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x388);
                            *(uint *)(local_b90.ray + 0x38c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x38c);
                            *(uint *)(local_b90.ray + 0x390) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x390);
                            *(uint *)(local_b90.ray + 0x394) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x394);
                            *(uint *)(local_b90.ray + 0x398) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x398);
                            *(uint *)(local_b90.ray + 0x39c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x39c);
                            *(uint *)(local_b90.ray + 0x3a0) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x3a0);
                            *(uint *)(local_b90.ray + 0x3a4) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x3a4);
                            *(uint *)(local_b90.ray + 0x3a8) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x3a8);
                            *(uint *)(local_b90.ray + 0x3ac) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x3ac);
                            *(uint *)(local_b90.ray + 0x3b0) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x3b0);
                            *(uint *)(local_b90.ray + 0x3b4) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x3b4);
                            *(uint *)(local_b90.ray + 0x3b8) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x3b8);
                            *(uint *)(local_b90.ray + 0x3bc) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x3bc);
                            iVar3 = *(int *)(local_b90.hit + 0xc4);
                            iVar4 = *(int *)(local_b90.hit + 200);
                            iVar1 = *(int *)(local_b90.hit + 0xcc);
                            iVar70 = *(int *)(local_b90.hit + 0xd0);
                            iVar71 = *(int *)(local_b90.hit + 0xd4);
                            iVar72 = *(int *)(local_b90.hit + 0xd8);
                            iVar73 = *(int *)(local_b90.hit + 0xdc);
                            iVar74 = *(int *)(local_b90.hit + 0xe0);
                            iVar75 = *(int *)(local_b90.hit + 0xe4);
                            iVar76 = *(int *)(local_b90.hit + 0xe8);
                            iVar77 = *(int *)(local_b90.hit + 0xec);
                            iVar78 = *(int *)(local_b90.hit + 0xf0);
                            iVar79 = *(int *)(local_b90.hit + 0xf4);
                            iVar80 = *(int *)(local_b90.hit + 0xf8);
                            iVar81 = *(int *)(local_b90.hit + 0xfc);
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x3c0) =
                                 (uint)(bVar97 & 1) * *(int *)(local_b90.hit + 0xc0) |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b90.ray + 0x3c0);
                            *(uint *)(local_b90.ray + 0x3c4) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 0x3c4);
                            *(uint *)(local_b90.ray + 0x3c8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x3c8);
                            *(uint *)(local_b90.ray + 0x3cc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x3cc);
                            *(uint *)(local_b90.ray + 0x3d0) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x3d0);
                            *(uint *)(local_b90.ray + 0x3d4) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x3d4);
                            *(uint *)(local_b90.ray + 0x3d8) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x3d8);
                            *(uint *)(local_b90.ray + 0x3dc) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x3dc);
                            *(uint *)(local_b90.ray + 0x3e0) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x3e0);
                            *(uint *)(local_b90.ray + 0x3e4) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x3e4);
                            *(uint *)(local_b90.ray + 1000) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 1000);
                            *(uint *)(local_b90.ray + 0x3ec) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x3ec);
                            *(uint *)(local_b90.ray + 0x3f0) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x3f0);
                            *(uint *)(local_b90.ray + 0x3f4) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x3f4);
                            *(uint *)(local_b90.ray + 0x3f8) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x3f8);
                            *(uint *)(local_b90.ray + 0x3fc) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x3fc);
                            iVar3 = *(int *)(local_b90.hit + 0x104);
                            iVar4 = *(int *)(local_b90.hit + 0x108);
                            iVar1 = *(int *)(local_b90.hit + 0x10c);
                            iVar70 = *(int *)(local_b90.hit + 0x110);
                            iVar71 = *(int *)(local_b90.hit + 0x114);
                            iVar72 = *(int *)(local_b90.hit + 0x118);
                            iVar73 = *(int *)(local_b90.hit + 0x11c);
                            iVar74 = *(int *)(local_b90.hit + 0x120);
                            iVar75 = *(int *)(local_b90.hit + 0x124);
                            iVar76 = *(int *)(local_b90.hit + 0x128);
                            iVar77 = *(int *)(local_b90.hit + 300);
                            iVar78 = *(int *)(local_b90.hit + 0x130);
                            iVar79 = *(int *)(local_b90.hit + 0x134);
                            iVar80 = *(int *)(local_b90.hit + 0x138);
                            iVar81 = *(int *)(local_b90.hit + 0x13c);
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar103 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar103 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar103 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                            bVar19 = (bool)((byte)(uVar103 >> 9) & 1);
                            bVar20 = (bool)((byte)(uVar103 >> 10) & 1);
                            bVar21 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            bVar22 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            bVar23 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            bVar24 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            bVar25 = SUB81(uVar103 >> 0xf,0);
                            *(uint *)(local_b90.ray + 0x400) =
                                 (uint)(bVar97 & 1) * *(int *)(local_b90.hit + 0x100) |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b90.ray + 0x400);
                            *(uint *)(local_b90.ray + 0x404) =
                                 (uint)bVar102 * iVar3 |
                                 (uint)!bVar102 * *(int *)(local_b90.ray + 0x404);
                            *(uint *)(local_b90.ray + 0x408) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_b90.ray + 0x408);
                            *(uint *)(local_b90.ray + 0x40c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_b90.ray + 0x40c);
                            *(uint *)(local_b90.ray + 0x410) =
                                 (uint)bVar15 * iVar70 |
                                 (uint)!bVar15 * *(int *)(local_b90.ray + 0x410);
                            *(uint *)(local_b90.ray + 0x414) =
                                 (uint)bVar16 * iVar71 |
                                 (uint)!bVar16 * *(int *)(local_b90.ray + 0x414);
                            *(uint *)(local_b90.ray + 0x418) =
                                 (uint)bVar17 * iVar72 |
                                 (uint)!bVar17 * *(int *)(local_b90.ray + 0x418);
                            *(uint *)(local_b90.ray + 0x41c) =
                                 (uint)bVar18 * iVar73 |
                                 (uint)!bVar18 * *(int *)(local_b90.ray + 0x41c);
                            *(uint *)(local_b90.ray + 0x420) =
                                 (uint)(bVar93 & 1) * iVar74 |
                                 (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x420);
                            *(uint *)(local_b90.ray + 0x424) =
                                 (uint)bVar19 * iVar75 |
                                 (uint)!bVar19 * *(int *)(local_b90.ray + 0x424);
                            *(uint *)(local_b90.ray + 0x428) =
                                 (uint)bVar20 * iVar76 |
                                 (uint)!bVar20 * *(int *)(local_b90.ray + 0x428);
                            *(uint *)(local_b90.ray + 0x42c) =
                                 (uint)bVar21 * iVar77 |
                                 (uint)!bVar21 * *(int *)(local_b90.ray + 0x42c);
                            *(uint *)(local_b90.ray + 0x430) =
                                 (uint)bVar22 * iVar78 |
                                 (uint)!bVar22 * *(int *)(local_b90.ray + 0x430);
                            *(uint *)(local_b90.ray + 0x434) =
                                 (uint)bVar23 * iVar79 |
                                 (uint)!bVar23 * *(int *)(local_b90.ray + 0x434);
                            *(uint *)(local_b90.ray + 0x438) =
                                 (uint)bVar24 * iVar80 |
                                 (uint)!bVar24 * *(int *)(local_b90.ray + 0x438);
                            *(uint *)(local_b90.ray + 0x43c) =
                                 (uint)bVar25 * iVar81 |
                                 (uint)!bVar25 * *(int *)(local_b90.ray + 0x43c);
                            auVar188 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x140));
                            auVar188 = vmovdqu32_avx512f(auVar188);
                            *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar188;
                            auVar188 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x180));
                            auVar188 = vmovdqu32_avx512f(auVar188);
                            *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar188;
                            auVar227 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x1c0));
                            auVar188 = vmovdqa32_avx512f(auVar227);
                            *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar188;
                            auVar188 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b90.hit + 0x200));
                            bVar102 = (bool)((byte)(uVar103 >> 1) & 1);
                            auVar66._4_56_ = auVar188._8_56_;
                            auVar66._0_4_ =
                                 (uint)bVar102 * auVar188._4_4_ | (uint)!bVar102 * auVar227._4_4_;
                            auVar161._0_8_ = auVar66._0_8_ << 0x20;
                            bVar102 = (bool)((byte)(uVar103 >> 2) & 1);
                            auVar161._8_4_ =
                                 (uint)bVar102 * auVar188._8_4_ | (uint)!bVar102 * auVar227._8_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 3) & 1);
                            auVar161._12_4_ =
                                 (uint)bVar102 * auVar188._12_4_ | (uint)!bVar102 * auVar227._12_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 4) & 1);
                            auVar161._16_4_ =
                                 (uint)bVar102 * auVar188._16_4_ | (uint)!bVar102 * auVar227._16_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 5) & 1);
                            auVar161._20_4_ =
                                 (uint)bVar102 * auVar188._20_4_ | (uint)!bVar102 * auVar227._20_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 6) & 1);
                            auVar161._24_4_ =
                                 (uint)bVar102 * auVar188._24_4_ | (uint)!bVar102 * auVar227._24_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 7) & 1);
                            auVar161._28_4_ =
                                 (uint)bVar102 * auVar188._28_4_ | (uint)!bVar102 * auVar227._28_4_;
                            auVar161._32_4_ =
                                 (uint)(bVar93 & 1) * auVar188._32_4_ |
                                 (uint)!(bool)(bVar93 & 1) * auVar227._32_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 9) & 1);
                            auVar161._36_4_ =
                                 (uint)bVar102 * auVar188._36_4_ | (uint)!bVar102 * auVar227._36_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 10) & 1);
                            auVar161._40_4_ =
                                 (uint)bVar102 * auVar188._40_4_ | (uint)!bVar102 * auVar227._40_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 0xb) & 1);
                            auVar161._44_4_ =
                                 (uint)bVar102 * auVar188._44_4_ | (uint)!bVar102 * auVar227._44_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 0xc) & 1);
                            auVar161._48_4_ =
                                 (uint)bVar102 * auVar188._48_4_ | (uint)!bVar102 * auVar227._48_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 0xd) & 1);
                            auVar161._52_4_ =
                                 (uint)bVar102 * auVar188._52_4_ | (uint)!bVar102 * auVar227._52_4_;
                            bVar102 = (bool)((byte)(uVar103 >> 0xe) & 1);
                            auVar161._56_4_ =
                                 (uint)bVar102 * auVar188._56_4_ | (uint)!bVar102 * auVar227._56_4_;
                            bVar102 = SUB81(uVar103 >> 0xf,0);
                            auVar161._60_4_ =
                                 (uint)bVar102 * auVar188._60_4_ | (uint)!bVar102 * auVar227._60_4_;
                            auVar188 = vmovdqa32_avx512f(auVar188);
                            *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar188;
                            goto LAB_01d4a309;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar255;
                      }
                    }
                  }
                }
LAB_01d4a309:
                auVar117 = auVar161._32_32_;
                bVar102 = lVar101 != 0;
                lVar101 = lVar101 + -1;
              } while ((!bVar12) && (bVar102));
              auVar85._4_4_ = fStack_87c;
              auVar85._0_4_ = local_880;
              auVar85._8_4_ = fStack_878;
              auVar85._12_4_ = fStack_874;
              auVar85._16_4_ = fStack_870;
              auVar85._20_4_ = fStack_86c;
              auVar85._24_4_ = fStack_868;
              auVar85._28_4_ = fStack_864;
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar41._4_4_ = uVar8;
              auVar41._0_4_ = uVar8;
              auVar41._8_4_ = uVar8;
              auVar41._12_4_ = uVar8;
              auVar41._16_4_ = uVar8;
              auVar41._20_4_ = uVar8;
              auVar41._24_4_ = uVar8;
              auVar41._28_4_ = uVar8;
              uVar27 = vcmpps_avx512vl(auVar85,auVar41,2);
              bVar98 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar98 & (byte)uVar27;
            } while (bVar98 != 0);
          }
          uVar29 = vpcmpd_avx512vl(local_820,_local_8a0,1);
          uVar28 = vpcmpd_avx512vl(local_820,local_780,1);
          auVar209._0_4_ = (float)local_940._0_4_ + (float)local_500._0_4_;
          auVar209._4_4_ = (float)local_940._4_4_ + (float)local_500._4_4_;
          auVar209._8_4_ = fStack_938 + fStack_4f8;
          auVar209._12_4_ = fStack_934 + fStack_4f4;
          auVar209._16_4_ = fStack_930 + fStack_4f0;
          auVar209._20_4_ = fStack_92c + fStack_4ec;
          auVar209._24_4_ = fStack_928 + fStack_4e8;
          auVar209._28_4_ = fStack_924 + fStack_4e4;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar226._4_4_ = uVar8;
          auVar226._0_4_ = uVar8;
          auVar226._8_4_ = uVar8;
          auVar226._12_4_ = uVar8;
          auVar226._16_4_ = uVar8;
          auVar226._20_4_ = uVar8;
          auVar226._24_4_ = uVar8;
          auVar226._28_4_ = uVar8;
          uVar27 = vcmpps_avx512vl(auVar209,auVar226,2);
          bVar94 = bVar94 & (byte)uVar28 & (byte)uVar27;
          auVar240._0_4_ = (float)local_940._0_4_ + (float)local_7c0._0_4_;
          auVar240._4_4_ = (float)local_940._4_4_ + (float)local_7c0._4_4_;
          auVar240._8_4_ = fStack_938 + fStack_7b8;
          auVar240._12_4_ = fStack_934 + fStack_7b4;
          auVar240._16_4_ = fStack_930 + fStack_7b0;
          auVar240._20_4_ = fStack_92c + fStack_7ac;
          auVar240._24_4_ = fStack_928 + fStack_7a8;
          auVar240._28_4_ = fStack_924 + fStack_7a4;
          uVar27 = vcmpps_avx512vl(auVar240,auVar226,2);
          bVar91 = bVar91 & (byte)uVar29 & (byte)uVar27 | bVar94;
          prim = local_b20;
          pPVar99 = local_b28;
          if (bVar91 == 0) {
            auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar188 = ZEXT3264(auVar119);
          }
          else {
            uVar103 = local_b10 & 0xffffffff;
            abStack_1a0[uVar103 * 0x60] = bVar91;
            bVar12 = (bool)(bVar94 >> 1 & 1);
            bVar102 = (bool)(bVar94 >> 2 & 1);
            bVar13 = (bool)(bVar94 >> 3 & 1);
            bVar14 = (bool)(bVar94 >> 4 & 1);
            bVar15 = (bool)(bVar94 >> 5 & 1);
            auStack_180[uVar103 * 0x18] =
                 (uint)(bVar94 & 1) * local_500._0_4_ | (uint)!(bool)(bVar94 & 1) * local_7c0._0_4_;
            auStack_180[uVar103 * 0x18 + 1] =
                 (uint)bVar12 * local_500._4_4_ | (uint)!bVar12 * local_7c0._4_4_;
            auStack_180[uVar103 * 0x18 + 2] =
                 (uint)bVar102 * (int)fStack_4f8 | (uint)!bVar102 * (int)fStack_7b8;
            auStack_180[uVar103 * 0x18 + 3] =
                 (uint)bVar13 * (int)fStack_4f4 | (uint)!bVar13 * (int)fStack_7b4;
            auStack_180[uVar103 * 0x18 + 4] =
                 (uint)bVar14 * (int)fStack_4f0 | (uint)!bVar14 * (int)fStack_7b0;
            auStack_180[uVar103 * 0x18 + 5] =
                 (uint)bVar15 * (int)fStack_4ec | (uint)!bVar15 * (int)fStack_7ac;
            auStack_180[uVar103 * 0x18 + 6] =
                 (uint)(bVar94 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar94 >> 6) * (int)fStack_7a8;
            (&fStack_164)[uVar103 * 0x18] = fStack_7a4;
            uVar27 = vmovlps_avx(local_b40);
            (&uStack_160)[uVar103 * 0xc] = uVar27;
            afStack_158[uVar103 * 0x18] = (float)((int)local_b18 + 1);
            local_b10 = (ulong)((int)local_b10 + 1);
            auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar188 = ZEXT3264(auVar119);
          }
        }
      }
    }
    auVar227 = ZEXT1664(local_b40);
    local_b10 = local_b10 & 0xffffffff;
    do {
      if ((int)local_b10 == 0) {
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar43._4_4_ = uVar5;
        auVar43._0_4_ = uVar5;
        auVar43._8_4_ = uVar5;
        auVar43._12_4_ = uVar5;
        auVar43._16_4_ = uVar5;
        auVar43._20_4_ = uVar5;
        auVar43._24_4_ = uVar5;
        auVar43._28_4_ = uVar5;
        uVar27 = vcmpps_avx512vl(local_760,auVar43,2);
        uVar100 = (uint)local_b08 & (uint)uVar27;
        local_b08 = (ulong)uVar100;
        if (uVar100 == 0) {
          return;
        }
        goto LAB_01d47fd2;
      }
      uVar103 = (ulong)((int)local_b10 - 1);
      auVar119 = *(undefined1 (*) [32])(auStack_180 + uVar103 * 0x18);
      auVar210._0_4_ = auVar119._0_4_ + (float)local_940._0_4_;
      auVar210._4_4_ = auVar119._4_4_ + (float)local_940._4_4_;
      auVar210._8_4_ = auVar119._8_4_ + fStack_938;
      auVar210._12_4_ = auVar119._12_4_ + fStack_934;
      auVar210._16_4_ = auVar119._16_4_ + fStack_930;
      auVar210._20_4_ = auVar119._20_4_ + fStack_92c;
      auVar210._24_4_ = auVar119._24_4_ + fStack_928;
      auVar210._28_4_ = auVar119._28_4_ + fStack_924;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar42._4_4_ = uVar8;
      auVar42._0_4_ = uVar8;
      auVar42._8_4_ = uVar8;
      auVar42._12_4_ = uVar8;
      auVar42._16_4_ = uVar8;
      auVar42._20_4_ = uVar8;
      auVar42._24_4_ = uVar8;
      auVar42._28_4_ = uVar8;
      uVar27 = vcmpps_avx512vl(auVar210,auVar42,2);
      uVar104 = (uint)uVar27 & (uint)abStack_1a0[uVar103 * 0x60];
      bVar91 = (byte)uVar104;
      if (uVar104 != 0) {
        auVar211._8_4_ = 0x7f800000;
        auVar211._0_8_ = 0x7f8000007f800000;
        auVar211._12_4_ = 0x7f800000;
        auVar211._16_4_ = 0x7f800000;
        auVar211._20_4_ = 0x7f800000;
        auVar211._24_4_ = 0x7f800000;
        auVar211._28_4_ = 0x7f800000;
        auVar120 = vblendmps_avx512vl(auVar211,auVar119);
        auVar155._0_4_ =
             (uint)(bVar91 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar91 & 1) * (int)auVar119._0_4_;
        bVar12 = (bool)((byte)(uVar104 >> 1) & 1);
        auVar155._4_4_ = (uint)bVar12 * auVar120._4_4_ | (uint)!bVar12 * (int)auVar119._4_4_;
        bVar12 = (bool)((byte)(uVar104 >> 2) & 1);
        auVar155._8_4_ = (uint)bVar12 * auVar120._8_4_ | (uint)!bVar12 * (int)auVar119._8_4_;
        bVar12 = (bool)((byte)(uVar104 >> 3) & 1);
        auVar155._12_4_ = (uint)bVar12 * auVar120._12_4_ | (uint)!bVar12 * (int)auVar119._12_4_;
        bVar12 = (bool)((byte)(uVar104 >> 4) & 1);
        auVar155._16_4_ = (uint)bVar12 * auVar120._16_4_ | (uint)!bVar12 * (int)auVar119._16_4_;
        bVar12 = (bool)((byte)(uVar104 >> 5) & 1);
        auVar155._20_4_ = (uint)bVar12 * auVar120._20_4_ | (uint)!bVar12 * (int)auVar119._20_4_;
        bVar12 = (bool)((byte)(uVar104 >> 6) & 1);
        auVar155._24_4_ = (uint)bVar12 * auVar120._24_4_ | (uint)!bVar12 * (int)auVar119._24_4_;
        auVar155._28_4_ =
             (uVar104 >> 7) * auVar120._28_4_ | (uint)!SUB41(uVar104 >> 7,0) * (int)auVar119._28_4_;
        auVar119 = vshufps_avx(auVar155,auVar155,0xb1);
        auVar119 = vminps_avx(auVar155,auVar119);
        auVar120 = vshufpd_avx(auVar119,auVar119,5);
        auVar119 = vminps_avx(auVar119,auVar120);
        auVar120 = vpermpd_avx2(auVar119,0x4e);
        auVar119 = vminps_avx(auVar119,auVar120);
        uVar27 = vcmpps_avx512vl(auVar155,auVar119,0);
        bVar98 = (byte)uVar27 & bVar91;
        if (bVar98 != 0) {
          uVar104 = (uint)bVar98;
        }
        fVar169 = afStack_158[uVar103 * 0x18 + -1];
        uVar162 = 0;
        for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000) {
          uVar162 = uVar162 + 1;
        }
        local_b18 = (ulong)(uint)afStack_158[uVar103 * 0x18];
        bVar98 = ~('\x01' << ((byte)uVar162 & 0x1f)) & bVar91;
        abStack_1a0[uVar103 * 0x60] = bVar98;
        uVar95 = uVar103;
        if (bVar98 != 0) {
          uVar95 = local_b10;
        }
        fVar253 = *(float *)(&uStack_160 + uVar103 * 0xc);
        auVar212._4_4_ = fVar253;
        auVar212._0_4_ = fVar253;
        auVar212._8_4_ = fVar253;
        auVar212._12_4_ = fVar253;
        auVar212._16_4_ = fVar253;
        auVar212._20_4_ = fVar253;
        auVar212._24_4_ = fVar253;
        auVar212._28_4_ = fVar253;
        fVar169 = fVar169 - fVar253;
        auVar187._4_4_ = fVar169;
        auVar187._0_4_ = fVar169;
        auVar187._8_4_ = fVar169;
        auVar187._12_4_ = fVar169;
        auVar187._16_4_ = fVar169;
        auVar187._20_4_ = fVar169;
        auVar187._24_4_ = fVar169;
        auVar187._28_4_ = fVar169;
        auVar108 = vfmadd132ps_fma(auVar187,auVar212,_DAT_02020f20);
        auVar119 = ZEXT1632(auVar108);
        local_400[0] = (RTCHitN)auVar119[0];
        local_400[1] = (RTCHitN)auVar119[1];
        local_400[2] = (RTCHitN)auVar119[2];
        local_400[3] = (RTCHitN)auVar119[3];
        local_400[4] = (RTCHitN)auVar119[4];
        local_400[5] = (RTCHitN)auVar119[5];
        local_400[6] = (RTCHitN)auVar119[6];
        local_400[7] = (RTCHitN)auVar119[7];
        local_400[8] = (RTCHitN)auVar119[8];
        local_400[9] = (RTCHitN)auVar119[9];
        local_400[10] = (RTCHitN)auVar119[10];
        local_400[0xb] = (RTCHitN)auVar119[0xb];
        local_400[0xc] = (RTCHitN)auVar119[0xc];
        local_400[0xd] = (RTCHitN)auVar119[0xd];
        local_400[0xe] = (RTCHitN)auVar119[0xe];
        local_400[0xf] = (RTCHitN)auVar119[0xf];
        local_400[0x10] = (RTCHitN)auVar119[0x10];
        local_400[0x11] = (RTCHitN)auVar119[0x11];
        local_400[0x12] = (RTCHitN)auVar119[0x12];
        local_400[0x13] = (RTCHitN)auVar119[0x13];
        local_400[0x14] = (RTCHitN)auVar119[0x14];
        local_400[0x15] = (RTCHitN)auVar119[0x15];
        local_400[0x16] = (RTCHitN)auVar119[0x16];
        local_400[0x17] = (RTCHitN)auVar119[0x17];
        local_400[0x18] = (RTCHitN)auVar119[0x18];
        local_400[0x19] = (RTCHitN)auVar119[0x19];
        local_400[0x1a] = (RTCHitN)auVar119[0x1a];
        local_400[0x1b] = (RTCHitN)auVar119[0x1b];
        local_400[0x1c] = (RTCHitN)auVar119[0x1c];
        local_400[0x1d] = (RTCHitN)auVar119[0x1d];
        local_400[0x1e] = (RTCHitN)auVar119[0x1e];
        local_400[0x1f] = (RTCHitN)auVar119[0x1f];
        auVar227 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar162 * 4));
        uVar103 = uVar95;
      }
      local_b10 = uVar103;
    } while (bVar91 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }